

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cms_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  CmsQueryListMetricRequestType *this;
  HttpTestListener *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_2b9;
  string local_2b8;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238;
  CmsBatchCreateMetricsRequestType req;
  _Alloc_hider local_1b8;
  undefined1 local_1b0 [24];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  CmsBatchCreateMetricsResponseType resp;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
  req.project_name._M_string_length = 0;
  req.project_name.field_2._M_allocated_capacity =
       req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  req.metric_stream_name._M_dataplus._M_p = (pointer)&req.metric_stream_name.field_2;
  req.metric_stream_name._M_string_length = 0;
  req.metric_stream_name.field_2._M_local_buf[0] = '\0';
  req.sqls._M_dataplus._M_p = (pointer)&req.sqls.field_2;
  req.sqls._M_string_length = 0;
  paVar1 = &resp.code.field_2;
  resp.code._M_string_length = 0;
  resp.code.field_2._M_allocated_capacity =
       resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
  paVar2 = &resp.message.field_2;
  resp.message._M_string_length = 0;
  resp.message.field_2._M_local_buf[0] = '\0';
  paVar3 = &resp.success.field_2;
  resp.success._M_string_length = 0;
  resp.success.field_2._M_local_buf[0] = '\0';
  paVar4 = &resp.trace_id.field_2;
  resp.trace_id._M_string_length = 0;
  req.sqls.field_2._M_local_buf[0] = '\0';
  resp.trace_id.field_2._M_local_buf[0] = '\0';
  resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
  resp.result._M_string_length = 0;
  resp.result.field_2._M_local_buf[0] = '\0';
  resp.code._M_dataplus._M_p = (pointer)paVar1;
  resp.message._M_dataplus._M_p = (pointer)paVar2;
  resp.success._M_dataplus._M_p = (pointer)paVar3;
  resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,"my_appid",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>(local_298,"my_secret",&local_2b9);
  this = (CmsQueryListMetricRequestType *)
         aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_258);
  if (this == (CmsQueryListMetricRequestType *)0x0) {
    aliyun::CmsBatchCreateMetricsResponseType::~CmsBatchCreateMetricsResponseType(&resp);
    aliyun::CmsBatchCreateMetricsRequestType::~CmsBatchCreateMetricsRequestType(&req);
    req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
    req.project_name._M_string_length = 0;
    req.project_name.field_2._M_allocated_capacity =
         req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    req.metric_stream_name._M_dataplus._M_p = (pointer)&req.metric_stream_name.field_2;
    req.metric_stream_name._M_string_length = 0;
    req.metric_stream_name.field_2._M_local_buf[0] = '\0';
    req.sqls._M_dataplus._M_p = (pointer)&req.sqls.field_2;
    req.sqls._M_string_length = 0;
    resp.code._M_string_length = 0;
    resp.code.field_2._M_allocated_capacity =
         resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
    resp.message._M_string_length = 0;
    resp.message.field_2._M_local_buf[0] = '\0';
    resp.success._M_string_length = 0;
    resp.success.field_2._M_local_buf[0] = '\0';
    resp.trace_id._M_string_length = 0;
    req.sqls.field_2._M_local_buf[0] = '\0';
    resp.trace_id.field_2._M_local_buf[0] = '\0';
    resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
    resp.result._M_string_length = 0;
    resp.result.field_2._M_local_buf[0] = '\0';
    resp.code._M_dataplus._M_p = (pointer)paVar1;
    resp.message._M_dataplus._M_p = (pointer)paVar2;
    resp.success._M_dataplus._M_p = (pointer)paVar3;
    resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::string<std::allocator<char>>
              (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
    std::__cxx11::string::string<std::allocator<char>>
              (local_278,"my_appid",(allocator<char> *)&local_2b8);
    std::__cxx11::string::string<std::allocator<char>>(local_298,"my_secret",&local_2b9);
    this = (CmsQueryListMetricRequestType *)
           aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_278);
    std::__cxx11::string::~string(local_258);
    if (this == (CmsQueryListMetricRequestType *)0x0) {
      aliyun::CmsBatchCreateSqlMetricsResponseType::~CmsBatchCreateSqlMetricsResponseType
                ((CmsBatchCreateSqlMetricsResponseType *)&resp);
      aliyun::CmsBatchCreateSqlMetricsRequestType::~CmsBatchCreateSqlMetricsRequestType
                ((CmsBatchCreateSqlMetricsRequestType *)&req);
      req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
      req.project_name._M_string_length = 0;
      req.project_name.field_2._M_allocated_capacity =
           req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      req.metric_stream_name._M_dataplus._M_p = (pointer)&req.metric_stream_name.field_2;
      req.metric_stream_name._M_string_length = 0;
      resp.code._M_string_length = 0;
      resp.code.field_2._M_allocated_capacity =
           resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
      resp.message._M_string_length = 0;
      resp.message.field_2._M_local_buf[0] = '\0';
      resp.success._M_string_length = 0;
      req.metric_stream_name.field_2._M_local_buf[0] = '\0';
      resp.success.field_2._M_local_buf[0] = '\0';
      resp.trace_id._M_string_length = 0;
      resp.trace_id.field_2._M_local_buf[0] = '\0';
      resp.code._M_dataplus._M_p = (pointer)paVar1;
      resp.message._M_dataplus._M_p = (pointer)paVar2;
      resp.success._M_dataplus._M_p = (pointer)paVar3;
      resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::string<std::allocator<char>>
                (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
      std::__cxx11::string::string<std::allocator<char>>
                (local_278,"my_appid",(allocator<char> *)&local_2b8);
      std::__cxx11::string::string<std::allocator<char>>(local_298,"my_secret",&local_2b9);
      this = (CmsQueryListMetricRequestType *)
             aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_258);
      if (this == (CmsQueryListMetricRequestType *)0x0) {
        aliyun::CmsBatchPutDimTableDataResponseType::~CmsBatchPutDimTableDataResponseType
                  ((CmsBatchPutDimTableDataResponseType *)&resp);
        aliyun::CmsBatchPutDimTableDataRequestType::~CmsBatchPutDimTableDataRequestType
                  ((CmsBatchPutDimTableDataRequestType *)&req);
        resp.code._M_string_length = 0;
        resp.code.field_2._M_allocated_capacity =
             resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
        resp.message._M_string_length = 0;
        resp.message.field_2._M_local_buf[0] = '\0';
        resp.success._M_string_length = 0;
        resp.success.field_2._M_local_buf[0] = '\0';
        resp.trace_id._M_string_length = 0;
        resp.trace_id.field_2._M_local_buf[0] = '\0';
        resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
        resp.result._M_string_length = 0;
        resp.result.field_2._M_local_buf[0] = '\0';
        local_d8._M_p = (pointer)&local_c8;
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        local_b8._M_p = (pointer)&local_a8;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        local_98._M_p = (pointer)&local_88;
        local_90 = 0;
        req.project_name._M_dataplus._M_p = (pointer)0x0;
        req.project_name._M_string_length = 0;
        req.project_name.field_2._M_allocated_capacity = 0;
        req.project_name.field_2._8_8_ = &req.metric_stream_name._M_string_length;
        req.metric_stream_name._M_dataplus._M_p = (pointer)0x0;
        req.metric_stream_name._M_string_length =
             req.metric_stream_name._M_string_length & 0xffffffffffffff00;
        req.metric_stream_name.field_2._8_8_ = &req.sqls._M_string_length;
        req.sqls._M_dataplus._M_p = (pointer)0x0;
        req.sqls._M_string_length = req.sqls._M_string_length & 0xffffffffffffff00;
        req.sqls.field_2._8_8_ = local_1b0;
        local_1b8._M_p = (pointer)0x0;
        local_88._M_local_buf[0] = '\0';
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
        local_1b0._16_8_ = &local_190;
        local_198._M_p = (pointer)0x0;
        local_190._M_local_buf[0] = '\0';
        resp.code._M_dataplus._M_p = (pointer)paVar1;
        resp.message._M_dataplus._M_p = (pointer)paVar2;
        resp.success._M_dataplus._M_p = (pointer)paVar3;
        resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_278,"my_appid",(allocator<char> *)&local_2b8);
        std::__cxx11::string::string<std::allocator<char>>(local_298,"my_secret",&local_2b9);
        this = (CmsQueryListMetricRequestType *)
               aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::~string(local_278);
        std::__cxx11::string::~string(local_258);
        if (this == (CmsQueryListMetricRequestType *)0x0) {
          aliyun::CmsBatchQueryMetricResponseType::~CmsBatchQueryMetricResponseType
                    ((CmsBatchQueryMetricResponseType *)&req);
          aliyun::CmsBatchQueryMetricRequestType::~CmsBatchQueryMetricRequestType
                    ((CmsBatchQueryMetricRequestType *)&resp);
          req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
          req.project_name._M_string_length = 0;
          resp.code._M_string_length = 0;
          resp.code.field_2._M_allocated_capacity =
               resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
          resp.message._M_string_length = 0;
          resp.message.field_2._M_local_buf[0] = '\0';
          resp.success._M_string_length = 0;
          req.project_name.field_2._M_allocated_capacity =
               req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          resp.success.field_2._M_local_buf[0] = '\0';
          resp.trace_id._M_string_length = 0;
          resp.trace_id.field_2._M_local_buf[0] = '\0';
          resp.code._M_dataplus._M_p = (pointer)paVar1;
          resp.message._M_dataplus._M_p = (pointer)paVar2;
          resp.success._M_dataplus._M_p = (pointer)paVar3;
          resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::string<std::allocator<char>>
                    (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_278,"my_appid",(allocator<char> *)&local_2b8);
          std::__cxx11::string::string<std::allocator<char>>(local_298,"my_secret",&local_2b9);
          this = (CmsQueryListMetricRequestType *)
                 aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
          std::__cxx11::string::~string(local_298);
          std::__cxx11::string::~string(local_278);
          std::__cxx11::string::~string(local_258);
          if (this == (CmsQueryListMetricRequestType *)0x0) {
            aliyun::CmsCreateDimTableResponseType::~CmsCreateDimTableResponseType
                      ((CmsCreateDimTableResponseType *)&resp);
            std::__cxx11::string::~string((string *)&req);
            req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
            req.project_name._M_string_length = 0;
            req.project_name.field_2._M_allocated_capacity =
                 req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
            req.metric_stream_name._M_dataplus._M_p = (pointer)&req.metric_stream_name.field_2;
            req.metric_stream_name._M_string_length = 0;
            req.metric_stream_name.field_2._M_local_buf[0] = '\0';
            req.sqls._M_dataplus._M_p = (pointer)&req.sqls.field_2;
            req.sqls._M_string_length = 0;
            resp.code._M_string_length = 0;
            resp.code.field_2._M_allocated_capacity =
                 resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
            resp.message._M_string_length = 0;
            resp.message.field_2._M_local_buf[0] = '\0';
            resp.success._M_string_length = 0;
            resp.success.field_2._M_local_buf[0] = '\0';
            resp.trace_id._M_string_length = 0;
            req.sqls.field_2._M_local_buf[0] = '\0';
            resp.trace_id.field_2._M_local_buf[0] = '\0';
            resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
            resp.result._M_string_length = 0;
            resp.result.field_2._M_local_buf[0] = '\0';
            resp.code._M_dataplus._M_p = (pointer)paVar1;
            resp.message._M_dataplus._M_p = (pointer)paVar2;
            resp.success._M_dataplus._M_p = (pointer)paVar3;
            resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::string<std::allocator<char>>
                      (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_278,"my_appid",(allocator<char> *)&local_2b8);
            std::__cxx11::string::string<std::allocator<char>>(local_298,"my_secret",&local_2b9);
            this = (CmsQueryListMetricRequestType *)
                   aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
            std::__cxx11::string::~string(local_298);
            std::__cxx11::string::~string(local_278);
            std::__cxx11::string::~string(local_258);
            if (this == (CmsQueryListMetricRequestType *)0x0) {
              aliyun::CmsCreateMetricsResponseType::~CmsCreateMetricsResponseType
                        ((CmsCreateMetricsResponseType *)&resp);
              aliyun::CmsCreateMetricsRequestType::~CmsCreateMetricsRequestType
                        ((CmsCreateMetricsRequestType *)&req);
              req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
              req.project_name._M_string_length = 0;
              req.project_name.field_2._M_allocated_capacity =
                   req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
              req.metric_stream_name._M_dataplus._M_p = (pointer)&req.metric_stream_name.field_2;
              req.metric_stream_name._M_string_length = 0;
              resp.code._M_string_length = 0;
              resp.code.field_2._M_allocated_capacity =
                   resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
              resp.message._M_string_length = 0;
              resp.message.field_2._M_local_buf[0] = '\0';
              resp.success._M_string_length = 0;
              resp.success.field_2._M_local_buf[0] = '\0';
              resp.trace_id._M_string_length = 0;
              req.metric_stream_name.field_2._M_local_buf[0] = '\0';
              resp.trace_id.field_2._M_local_buf[0] = '\0';
              resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
              resp.result._M_string_length = 0;
              resp.result.field_2._M_local_buf[0] = '\0';
              resp.code._M_dataplus._M_p = (pointer)paVar1;
              resp.message._M_dataplus._M_p = (pointer)paVar2;
              resp.success._M_dataplus._M_p = (pointer)paVar3;
              resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_278,"my_appid",(allocator<char> *)&local_2b8);
              std::__cxx11::string::string<std::allocator<char>>(local_298,"my_secret",&local_2b9);
              this = (CmsQueryListMetricRequestType *)
                     aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
              std::__cxx11::string::~string(local_298);
              std::__cxx11::string::~string(local_278);
              std::__cxx11::string::~string(local_258);
              if (this == (CmsQueryListMetricRequestType *)0x0) {
                aliyun::CmsCreateMetricStreamResponseType::~CmsCreateMetricStreamResponseType
                          ((CmsCreateMetricStreamResponseType *)&resp);
                aliyun::CmsCreateMetricStreamRequestType::~CmsCreateMetricStreamRequestType
                          ((CmsCreateMetricStreamRequestType *)&req);
                req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
                req.project_name._M_string_length = 0;
                resp.code._M_string_length = 0;
                resp.code.field_2._M_allocated_capacity =
                     resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                resp.message._M_string_length = 0;
                resp.message.field_2._M_local_buf[0] = '\0';
                resp.success._M_string_length = 0;
                resp.success.field_2._M_local_buf[0] = '\0';
                resp.trace_id._M_string_length = 0;
                req.project_name.field_2._M_allocated_capacity =
                     req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                resp.trace_id.field_2._M_local_buf[0] = '\0';
                resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
                resp.result._M_string_length = 0;
                resp.result.field_2._M_local_buf[0] = '\0';
                resp.code._M_dataplus._M_p = (pointer)paVar1;
                resp.message._M_dataplus._M_p = (pointer)paVar2;
                resp.success._M_dataplus._M_p = (pointer)paVar3;
                resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_278,"my_appid",(allocator<char> *)&local_2b8);
                std::__cxx11::string::string<std::allocator<char>>(local_298,"my_secret",&local_2b9)
                ;
                this = (CmsQueryListMetricRequestType *)
                       aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string(local_278);
                std::__cxx11::string::~string(local_258);
                if (this == (CmsQueryListMetricRequestType *)0x0) {
                  aliyun::CmsCreateProjectResponseType::~CmsCreateProjectResponseType
                            ((CmsCreateProjectResponseType *)&resp);
                  std::__cxx11::string::~string((string *)&req);
                  req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
                  req.project_name._M_string_length = 0;
                  req.project_name.field_2._M_allocated_capacity =
                       req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  req.metric_stream_name._M_dataplus._M_p = (pointer)&req.metric_stream_name.field_2
                  ;
                  req.metric_stream_name._M_string_length = 0;
                  req.metric_stream_name.field_2._M_local_buf[0] = '\0';
                  req.sqls._M_dataplus._M_p = (pointer)&req.sqls.field_2;
                  req.sqls._M_string_length = 0;
                  resp.code._M_string_length = 0;
                  resp.code.field_2._M_allocated_capacity =
                       resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  resp.message._M_string_length = 0;
                  resp.message.field_2._M_local_buf[0] = '\0';
                  resp.success._M_string_length = 0;
                  resp.success.field_2._M_local_buf[0] = '\0';
                  resp.trace_id._M_string_length = 0;
                  req.sqls.field_2._M_local_buf[0] = '\0';
                  resp.trace_id.field_2._M_local_buf[0] = '\0';
                  resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
                  resp.result._M_string_length = 0;
                  resp.result.field_2._M_local_buf[0] = '\0';
                  resp.code._M_dataplus._M_p = (pointer)paVar1;
                  resp.message._M_dataplus._M_p = (pointer)paVar2;
                  resp.success._M_dataplus._M_p = (pointer)paVar3;
                  resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_278,"my_appid",(allocator<char> *)&local_2b8);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_298,"my_secret",&local_2b9);
                  this = (CmsQueryListMetricRequestType *)
                         aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
                  std::__cxx11::string::~string(local_298);
                  std::__cxx11::string::~string(local_278);
                  std::__cxx11::string::~string(local_258);
                  if (this == (CmsQueryListMetricRequestType *)0x0) {
                    aliyun::CmsCreateSQLMetricsResponseType::~CmsCreateSQLMetricsResponseType
                              ((CmsCreateSQLMetricsResponseType *)&resp);
                    aliyun::CmsCreateSQLMetricsRequestType::~CmsCreateSQLMetricsRequestType
                              ((CmsCreateSQLMetricsRequestType *)&req);
                    req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
                    req.project_name._M_string_length = 0;
                    resp.code._M_string_length = 0;
                    resp.code.field_2._M_allocated_capacity =
                         resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    resp.message._M_string_length = 0;
                    resp.message.field_2._M_local_buf[0] = '\0';
                    resp.success._M_string_length = 0;
                    req.project_name.field_2._M_allocated_capacity =
                         req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    resp.success.field_2._M_local_buf[0] = '\0';
                    resp.trace_id._M_string_length = 0;
                    resp.trace_id.field_2._M_local_buf[0] = '\0';
                    resp.code._M_dataplus._M_p = (pointer)paVar1;
                    resp.message._M_dataplus._M_p = (pointer)paVar2;
                    resp.success._M_dataplus._M_p = (pointer)paVar3;
                    resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_278,"my_appid",(allocator<char> *)&local_2b8);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_298,"my_secret",&local_2b9);
                    this = (CmsQueryListMetricRequestType *)
                           aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
                    std::__cxx11::string::~string(local_298);
                    std::__cxx11::string::~string(local_278);
                    std::__cxx11::string::~string(local_258);
                    if (this == (CmsQueryListMetricRequestType *)0x0) {
                      aliyun::CmsDeleteDimTableResponseType::~CmsDeleteDimTableResponseType
                                ((CmsDeleteDimTableResponseType *)&resp);
                      std::__cxx11::string::~string((string *)&req);
                      req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
                      req.project_name._M_string_length = 0;
                      req.project_name.field_2._M_allocated_capacity =
                           req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      req.metric_stream_name._M_dataplus._M_p =
                           (pointer)&req.metric_stream_name.field_2;
                      req.metric_stream_name._M_string_length = 0;
                      resp.code._M_string_length = 0;
                      resp.code.field_2._M_allocated_capacity =
                           resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      resp.message._M_string_length = 0;
                      resp.message.field_2._M_local_buf[0] = '\0';
                      resp.success._M_string_length = 0;
                      req.metric_stream_name.field_2._M_local_buf[0] = '\0';
                      resp.success.field_2._M_local_buf[0] = '\0';
                      resp.trace_id._M_string_length = 0;
                      resp.trace_id.field_2._M_local_buf[0] = '\0';
                      resp.code._M_dataplus._M_p = (pointer)paVar1;
                      resp.message._M_dataplus._M_p = (pointer)paVar2;
                      resp.success._M_dataplus._M_p = (pointer)paVar3;
                      resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_278,"my_appid",(allocator<char> *)&local_2b8);
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_298,"my_secret",&local_2b9);
                      this = (CmsQueryListMetricRequestType *)
                             aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
                      std::__cxx11::string::~string(local_298);
                      std::__cxx11::string::~string(local_278);
                      std::__cxx11::string::~string(local_258);
                      if (this == (CmsQueryListMetricRequestType *)0x0) {
                        aliyun::CmsDeleteDimTableDataResponseType::
                        ~CmsDeleteDimTableDataResponseType
                                  ((CmsDeleteDimTableDataResponseType *)&resp);
                        aliyun::CmsDeleteDimTableDataRequestType::~CmsDeleteDimTableDataRequestType
                                  ((CmsDeleteDimTableDataRequestType *)&req);
                        req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
                        req.project_name._M_string_length = 0;
                        req.project_name.field_2._M_allocated_capacity =
                             req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        req.metric_stream_name._M_dataplus._M_p =
                             (pointer)&req.metric_stream_name.field_2;
                        req.metric_stream_name._M_string_length = 0;
                        resp.code._M_string_length = 0;
                        resp.code.field_2._M_allocated_capacity =
                             resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        resp.message._M_string_length = 0;
                        resp.message.field_2._M_local_buf[0] = '\0';
                        resp.success._M_string_length = 0;
                        req.metric_stream_name.field_2._M_local_buf[0] = '\0';
                        resp.success.field_2._M_local_buf[0] = '\0';
                        resp.trace_id._M_string_length = 0;
                        resp.trace_id.field_2._M_local_buf[0] = '\0';
                        resp.code._M_dataplus._M_p = (pointer)paVar1;
                        resp.message._M_dataplus._M_p = (pointer)paVar2;
                        resp.success._M_dataplus._M_p = (pointer)paVar3;
                        resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_278,"my_appid",(allocator<char> *)&local_2b8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_298,"my_secret",&local_2b9);
                        this = (CmsQueryListMetricRequestType *)
                               aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
                        std::__cxx11::string::~string(local_298);
                        std::__cxx11::string::~string(local_278);
                        std::__cxx11::string::~string(local_258);
                        if (this == (CmsQueryListMetricRequestType *)0x0) {
                          aliyun::CmsDeleteMetricsResponseType::~CmsDeleteMetricsResponseType
                                    ((CmsDeleteMetricsResponseType *)&resp);
                          aliyun::CmsDeleteMetricsRequestType::~CmsDeleteMetricsRequestType
                                    ((CmsDeleteMetricsRequestType *)&req);
                          req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
                          req.project_name._M_string_length = 0;
                          req.project_name.field_2._M_allocated_capacity =
                               req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                          req.metric_stream_name._M_dataplus._M_p =
                               (pointer)&req.metric_stream_name.field_2;
                          req.metric_stream_name._M_string_length = 0;
                          resp.code._M_string_length = 0;
                          resp.code.field_2._M_allocated_capacity =
                               resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                          resp.message._M_string_length = 0;
                          resp.message.field_2._M_local_buf[0] = '\0';
                          resp.success._M_string_length = 0;
                          req.metric_stream_name.field_2._M_local_buf[0] = '\0';
                          resp.success.field_2._M_local_buf[0] = '\0';
                          resp.trace_id._M_string_length = 0;
                          resp.trace_id.field_2._M_local_buf[0] = '\0';
                          resp.code._M_dataplus._M_p = (pointer)paVar1;
                          resp.message._M_dataplus._M_p = (pointer)paVar2;
                          resp.success._M_dataplus._M_p = (pointer)paVar3;
                          resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_278,"my_appid",(allocator<char> *)&local_2b8);
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_298,"my_secret",&local_2b9);
                          this = (CmsQueryListMetricRequestType *)
                                 aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
                          std::__cxx11::string::~string(local_298);
                          std::__cxx11::string::~string(local_278);
                          std::__cxx11::string::~string(local_258);
                          if (this == (CmsQueryListMetricRequestType *)0x0) {
                            aliyun::CmsDeleteMetricStreamResponseType::
                            ~CmsDeleteMetricStreamResponseType
                                      ((CmsDeleteMetricStreamResponseType *)&resp);
                            aliyun::CmsDeleteMetricStreamRequestType::
                            ~CmsDeleteMetricStreamRequestType
                                      ((CmsDeleteMetricStreamRequestType *)&req);
                            req.project_name._M_dataplus._M_p = (pointer)&req.project_name.field_2;
                            req.project_name._M_string_length = 0;
                            resp.code._M_string_length = 0;
                            resp.code.field_2._M_allocated_capacity =
                                 resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            resp.message._M_string_length = 0;
                            resp.message.field_2._M_local_buf[0] = '\0';
                            resp.success._M_string_length = 0;
                            req.project_name.field_2._M_allocated_capacity =
                                 req.project_name.field_2._M_allocated_capacity & 0xffffffffffffff00
                            ;
                            resp.success.field_2._M_local_buf[0] = '\0';
                            resp.trace_id._M_string_length = 0;
                            resp.trace_id.field_2._M_local_buf[0] = '\0';
                            resp.code._M_dataplus._M_p = (pointer)paVar1;
                            resp.message._M_dataplus._M_p = (pointer)paVar2;
                            resp.success._M_dataplus._M_p = (pointer)paVar3;
                            resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_278,"my_appid",(allocator<char> *)&local_2b8);
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_298,"my_secret",&local_2b9);
                            this = (CmsQueryListMetricRequestType *)
                                   aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
                            std::__cxx11::string::~string(local_298);
                            std::__cxx11::string::~string(local_278);
                            std::__cxx11::string::~string(local_258);
                            if (this == (CmsQueryListMetricRequestType *)0x0) {
                              aliyun::CmsDeleteProjectResponseType::~CmsDeleteProjectResponseType
                                        ((CmsDeleteProjectResponseType *)&resp);
                              std::__cxx11::string::~string((string *)&req);
                              resp.code._M_string_length = 0;
                              resp.code.field_2._M_allocated_capacity =
                                   resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                              resp.message._M_string_length = 0;
                              resp.message.field_2._M_local_buf[0] = '\0';
                              resp.success._M_string_length = 0;
                              resp.success.field_2._M_local_buf[0] = '\0';
                              resp.trace_id._M_string_length = 0;
                              resp.trace_id.field_2._M_local_buf[0] = '\0';
                              resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
                              resp.result._M_string_length = 0;
                              resp.result.field_2._M_local_buf[0] = '\0';
                              local_d8._M_p = (pointer)&local_c8;
                              local_d0 = 0;
                              req.project_name._M_dataplus._M_p = (pointer)0x0;
                              req.project_name._M_string_length = 0;
                              req.project_name.field_2._M_allocated_capacity = 0;
                              req.project_name.field_2._8_8_ =
                                   &req.metric_stream_name._M_string_length;
                              req.metric_stream_name._M_dataplus._M_p = (pointer)0x0;
                              req.metric_stream_name._M_string_length =
                                   req.metric_stream_name._M_string_length & 0xffffffffffffff00;
                              req.metric_stream_name.field_2._8_8_ = &req.sqls._M_string_length;
                              req.sqls._M_dataplus._M_p = (pointer)0x0;
                              req.sqls._M_string_length =
                                   req.sqls._M_string_length & 0xffffffffffffff00;
                              req.sqls.field_2._8_8_ = local_1b0;
                              local_1b8._M_p = (pointer)0x0;
                              local_c8._M_local_buf[0] = '\0';
                              local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
                              local_1b0._16_8_ = &local_190;
                              local_198._M_p = (pointer)0x0;
                              local_190._M_local_buf[0] = '\0';
                              resp.code._M_dataplus._M_p = (pointer)paVar1;
                              resp.message._M_dataplus._M_p = (pointer)paVar2;
                              resp.success._M_dataplus._M_p = (pointer)paVar3;
                              resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_278,"my_appid",(allocator<char> *)&local_2b8);
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_298,"my_secret",&local_2b9);
                              this = (CmsQueryListMetricRequestType *)
                                     aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
                              std::__cxx11::string::~string(local_298);
                              std::__cxx11::string::~string(local_278);
                              std::__cxx11::string::~string(local_258);
                              if (this == (CmsQueryListMetricRequestType *)0x0) {
                                aliyun::CmsDescribeMetricResponseType::
                                ~CmsDescribeMetricResponseType
                                          ((CmsDescribeMetricResponseType *)&req);
                                aliyun::CmsDescribeMetricRequestType::~CmsDescribeMetricRequestType
                                          ((CmsDescribeMetricRequestType *)&resp);
                                resp.code._M_string_length = 0;
                                resp.code.field_2._M_allocated_capacity =
                                     resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                                resp.message._M_string_length = 0;
                                resp.message.field_2._M_local_buf[0] = '\0';
                                resp.success._M_string_length = 0;
                                resp.success.field_2._M_local_buf[0] = '\0';
                                resp.trace_id._M_string_length = 0;
                                resp.trace_id.field_2._M_local_buf[0] = '\0';
                                resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
                                resp.result._M_string_length = 0;
                                resp.result.field_2._M_local_buf[0] = '\0';
                                local_d8._M_p = (pointer)&local_c8;
                                local_d0 = 0;
                                local_c8._M_local_buf[0] = '\0';
                                local_b8._M_p = (pointer)&local_a8;
                                local_b0 = 0;
                                local_a8._M_local_buf[0] = '\0';
                                local_98._M_p = (pointer)&local_88;
                                local_90 = 0;
                                local_88._M_local_buf[0] = '\0';
                                local_78._M_p = (pointer)&local_68;
                                local_70 = 0;
                                req.project_name._M_dataplus._M_p = (pointer)0x0;
                                req.project_name._M_string_length = 0;
                                req.project_name.field_2._M_allocated_capacity = 0;
                                req.project_name.field_2._8_8_ =
                                     &req.metric_stream_name._M_string_length;
                                req.metric_stream_name._M_dataplus._M_p = (pointer)0x0;
                                req.metric_stream_name._M_string_length =
                                     req.metric_stream_name._M_string_length & 0xffffffffffffff00;
                                req.metric_stream_name.field_2._8_8_ = &req.sqls._M_string_length;
                                req.sqls._M_dataplus._M_p = (pointer)0x0;
                                req.sqls._M_string_length =
                                     req.sqls._M_string_length & 0xffffffffffffff00;
                                req.sqls.field_2._8_8_ = local_1b0;
                                local_1b8._M_p = (pointer)0x0;
                                local_68._M_local_buf[0] = '\0';
                                local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
                                local_1b0._16_8_ = &local_190;
                                local_198._M_p = (pointer)0x0;
                                local_190._M_local_buf[0] = '\0';
                                resp.code._M_dataplus._M_p = (pointer)paVar1;
                                resp.message._M_dataplus._M_p = (pointer)paVar2;
                                resp.success._M_dataplus._M_p = (pointer)paVar3;
                                resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_278,"my_appid",(allocator<char> *)&local_2b8);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_298,"my_secret",&local_2b9);
                                this = (CmsQueryListMetricRequestType *)
                                       aliyun::Cms::CreateCmsClient(local_258,local_278,local_298);
                                std::__cxx11::string::~string(local_298);
                                std::__cxx11::string::~string(local_278);
                                std::__cxx11::string::~string(local_258);
                                if (this == (CmsQueryListMetricRequestType *)0x0) {
                                  aliyun::CmsDescribeMetricDatumResponseType::
                                  ~CmsDescribeMetricDatumResponseType
                                            ((CmsDescribeMetricDatumResponseType *)&req);
                                  aliyun::CmsDescribeMetricDatumRequestType::
                                  ~CmsDescribeMetricDatumRequestType
                                            ((CmsDescribeMetricDatumRequestType *)&resp);
                                  resp.code._M_string_length = 0;
                                  resp.code.field_2._M_allocated_capacity =
                                       resp.code.field_2._M_allocated_capacity & 0xffffffffffffff00;
                                  resp.message._M_string_length = 0;
                                  resp.message.field_2._M_local_buf[0] = '\0';
                                  resp.success._M_string_length = 0;
                                  resp.success.field_2._M_local_buf[0] = '\0';
                                  resp.trace_id._M_string_length = 0;
                                  resp.trace_id.field_2._M_local_buf[0] = '\0';
                                  resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
                                  resp.result._M_string_length = 0;
                                  resp.result.field_2._M_local_buf[0] = '\0';
                                  local_d8._M_p = (pointer)&local_c8;
                                  local_d0 = 0;
                                  local_c8._M_local_buf[0] = '\0';
                                  local_b8._M_p = (pointer)&local_a8;
                                  local_b0 = 0;
                                  local_a8._M_local_buf[0] = '\0';
                                  local_98._M_p = (pointer)&local_88;
                                  local_90 = 0;
                                  req.project_name._M_dataplus._M_p = (pointer)0x0;
                                  req.project_name._M_string_length = 0;
                                  req.project_name.field_2._M_allocated_capacity = 0;
                                  req.project_name.field_2._8_8_ =
                                       &req.metric_stream_name._M_string_length;
                                  req.metric_stream_name._M_dataplus._M_p = (pointer)0x0;
                                  req.metric_stream_name._M_string_length =
                                       req.metric_stream_name._M_string_length & 0xffffffffffffff00;
                                  req.metric_stream_name.field_2._8_8_ = &req.sqls._M_string_length;
                                  req.sqls._M_dataplus._M_p = (pointer)0x0;
                                  req.sqls._M_string_length =
                                       req.sqls._M_string_length & 0xffffffffffffff00;
                                  req.sqls.field_2._8_8_ = local_1b0;
                                  local_1b8._M_p = (pointer)0x0;
                                  local_88._M_local_buf[0] = '\0';
                                  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
                                  local_1b0._16_8_ = &local_190;
                                  local_198._M_p = (pointer)0x0;
                                  local_190._M_local_buf[0] = '\0';
                                  resp.code._M_dataplus._M_p = (pointer)paVar1;
                                  resp.message._M_dataplus._M_p = (pointer)paVar2;
                                  resp.success._M_dataplus._M_p = (pointer)paVar3;
                                  resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_258,"cn-hangzhou",(allocator<char> *)&local_238);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_278,"my_appid",(allocator<char> *)&local_2b8);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_298,"my_secret",&local_2b9);
                                  this = (CmsQueryListMetricRequestType *)
                                         aliyun::Cms::CreateCmsClient(local_258,local_278,local_298)
                                  ;
                                  std::__cxx11::string::~string(local_298);
                                  std::__cxx11::string::~string(local_278);
                                  std::__cxx11::string::~string(local_258);
                                  if (this == (CmsQueryListMetricRequestType *)0x0) {
                                    aliyun::CmsDescribeMetricListResponseType::
                                    ~CmsDescribeMetricListResponseType
                                              ((CmsDescribeMetricListResponseType *)&req);
                                    aliyun::CmsDescribeMetricListRequestType::
                                    ~CmsDescribeMetricListRequestType
                                              ((CmsDescribeMetricListRequestType *)&resp);
                                    req.project_name._M_dataplus._M_p =
                                         (pointer)&req.project_name.field_2;
                                    req.project_name._M_string_length = 0;
                                    resp.code._M_string_length = 0;
                                    resp.code.field_2._M_allocated_capacity =
                                         resp.code.field_2._M_allocated_capacity &
                                         0xffffffffffffff00;
                                    resp.message._M_string_length = 0;
                                    resp.message.field_2._M_local_buf[0] = '\0';
                                    resp.success._M_string_length = 0;
                                    resp.success.field_2._M_local_buf[0] = '\0';
                                    resp.trace_id._M_string_length = 0;
                                    req.project_name.field_2._M_allocated_capacity =
                                         req.project_name.field_2._M_allocated_capacity &
                                         0xffffffffffffff00;
                                    resp.trace_id.field_2._M_local_buf[0] = '\0';
                                    resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
                                    resp.result._M_string_length = 0;
                                    resp.result.field_2._M_local_buf[0] = '\0';
                                    resp.code._M_dataplus._M_p = (pointer)paVar1;
                                    resp.message._M_dataplus._M_p = (pointer)paVar2;
                                    resp.success._M_dataplus._M_p = (pointer)paVar3;
                                    resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_258,"cn-hangzhou",(allocator<char> *)&local_238
                                              );
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_278,"my_appid",(allocator<char> *)&local_2b8);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_298,"my_secret",&local_2b9);
                                    this = (CmsQueryListMetricRequestType *)
                                           aliyun::Cms::CreateCmsClient
                                                     (local_258,local_278,local_298);
                                    std::__cxx11::string::~string(local_298);
                                    std::__cxx11::string::~string(local_278);
                                    std::__cxx11::string::~string(local_258);
                                    if (this == (CmsQueryListMetricRequestType *)0x0) {
                                      aliyun::CmsGetDimTableResponseType::
                                      ~CmsGetDimTableResponseType
                                                ((CmsGetDimTableResponseType *)&resp);
                                      std::__cxx11::string::~string((string *)&req);
                                      req.project_name._M_dataplus._M_p =
                                           (pointer)&req.project_name.field_2;
                                      req.project_name._M_string_length = 0;
                                      req.project_name.field_2._M_allocated_capacity =
                                           req.project_name.field_2._M_allocated_capacity &
                                           0xffffffffffffff00;
                                      req.metric_stream_name._M_dataplus._M_p =
                                           (pointer)&req.metric_stream_name.field_2;
                                      req.metric_stream_name._M_string_length = 0;
                                      req.metric_stream_name.field_2._M_local_buf[0] = '\0';
                                      req.sqls._M_dataplus._M_p = (pointer)&req.sqls.field_2;
                                      req.sqls._M_string_length = 0;
                                      resp.code._M_string_length = 0;
                                      resp.code.field_2._M_allocated_capacity =
                                           resp.code.field_2._M_allocated_capacity &
                                           0xffffffffffffff00;
                                      resp.message._M_string_length = 0;
                                      resp.message.field_2._M_local_buf[0] = '\0';
                                      resp.success._M_string_length = 0;
                                      resp.success.field_2._M_local_buf[0] = '\0';
                                      resp.trace_id._M_string_length = 0;
                                      req.sqls.field_2._M_local_buf[0] = '\0';
                                      resp.trace_id.field_2._M_local_buf[0] = '\0';
                                      resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2;
                                      resp.result._M_string_length = 0;
                                      resp.result.field_2._M_local_buf[0] = '\0';
                                      resp.code._M_dataplus._M_p = (pointer)paVar1;
                                      resp.message._M_dataplus._M_p = (pointer)paVar2;
                                      resp.success._M_dataplus._M_p = (pointer)paVar3;
                                      resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_258,"cn-hangzhou",
                                                 (allocator<char> *)&local_238);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_278,"my_appid",(allocator<char> *)&local_2b8)
                                      ;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_298,"my_secret",&local_2b9);
                                      this = (CmsQueryListMetricRequestType *)
                                             aliyun::Cms::CreateCmsClient
                                                       (local_258,local_278,local_298);
                                      std::__cxx11::string::~string(local_298);
                                      std::__cxx11::string::~string(local_278);
                                      std::__cxx11::string::~string(local_258);
                                      if (this == (CmsQueryListMetricRequestType *)0x0) {
                                        aliyun::CmsGetMetricsResponseType::
                                        ~CmsGetMetricsResponseType
                                                  ((CmsGetMetricsResponseType *)&resp);
                                        aliyun::CmsGetMetricsRequestType::~CmsGetMetricsRequestType
                                                  ((CmsGetMetricsRequestType *)&req);
                                        req.project_name._M_dataplus._M_p =
                                             (pointer)&req.project_name.field_2;
                                        req.project_name._M_string_length = 0;
                                        req.project_name.field_2._M_allocated_capacity =
                                             req.project_name.field_2._M_allocated_capacity &
                                             0xffffffffffffff00;
                                        req.metric_stream_name._M_dataplus._M_p =
                                             (pointer)&req.metric_stream_name.field_2;
                                        req.metric_stream_name._M_string_length = 0;
                                        resp.code._M_string_length = 0;
                                        resp.code.field_2._M_allocated_capacity =
                                             resp.code.field_2._M_allocated_capacity &
                                             0xffffffffffffff00;
                                        resp.message._M_string_length = 0;
                                        resp.message.field_2._M_local_buf[0] = '\0';
                                        resp.success._M_string_length = 0;
                                        resp.success.field_2._M_local_buf[0] = '\0';
                                        resp.trace_id._M_string_length = 0;
                                        req.metric_stream_name.field_2._M_local_buf[0] = '\0';
                                        resp.trace_id.field_2._M_local_buf[0] = '\0';
                                        resp.result._M_dataplus._M_p = (pointer)&resp.result.field_2
                                        ;
                                        resp.result._M_string_length = 0;
                                        resp.result.field_2._M_local_buf[0] = '\0';
                                        resp.code._M_dataplus._M_p = (pointer)paVar1;
                                        resp.message._M_dataplus._M_p = (pointer)paVar2;
                                        resp.success._M_dataplus._M_p = (pointer)paVar3;
                                        resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_258,"cn-hangzhou",
                                                   (allocator<char> *)&local_238);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_278,"my_appid",
                                                   (allocator<char> *)&local_2b8);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_298,"my_secret",&local_2b9);
                                        this = (CmsQueryListMetricRequestType *)
                                               aliyun::Cms::CreateCmsClient
                                                         (local_258,local_278,local_298);
                                        std::__cxx11::string::~string(local_298);
                                        std::__cxx11::string::~string(local_278);
                                        std::__cxx11::string::~string(local_258);
                                        if (this == (CmsQueryListMetricRequestType *)0x0) {
                                          aliyun::CmsGetMetricsMetaResponseType::
                                          ~CmsGetMetricsMetaResponseType
                                                    ((CmsGetMetricsMetaResponseType *)&resp);
                                          aliyun::CmsGetMetricsMetaRequestType::
                                          ~CmsGetMetricsMetaRequestType
                                                    ((CmsGetMetricsMetaRequestType *)&req);
                                          resp.code._M_string_length = 0;
                                          resp.code.field_2._M_allocated_capacity =
                                               resp.code.field_2._M_allocated_capacity &
                                               0xffffffffffffff00;
                                          resp.message._M_string_length = 0;
                                          resp.message.field_2._M_local_buf[0] = '\0';
                                          resp.success._M_string_length = 0;
                                          resp.success.field_2._M_local_buf[0] = '\0';
                                          resp.trace_id._M_string_length = 0;
                                          resp.trace_id.field_2._M_local_buf[0] = '\0';
                                          resp.result._M_dataplus._M_p =
                                               (pointer)&resp.result.field_2;
                                          resp.result._M_string_length = 0;
                                          resp.result.field_2._M_local_buf[0] = '\0';
                                          local_d8._M_p = (pointer)&local_c8;
                                          local_d0 = 0;
                                          local_c8._M_local_buf[0] = '\0';
                                          local_b8._M_p = (pointer)&local_a8;
                                          local_b0 = 0;
                                          local_a8._M_local_buf[0] = '\0';
                                          local_98._M_p = (pointer)&local_88;
                                          local_90 = 0;
                                          req.project_name._M_dataplus._M_p = (pointer)0x0;
                                          req.project_name._M_string_length = 0;
                                          req.project_name.field_2._M_allocated_capacity = 0;
                                          req.project_name.field_2._8_8_ =
                                               &req.metric_stream_name._M_string_length;
                                          req.metric_stream_name._M_dataplus._M_p = (pointer)0x0;
                                          req.metric_stream_name._M_string_length =
                                               req.metric_stream_name._M_string_length &
                                               0xffffffffffffff00;
                                          req.metric_stream_name.field_2._8_8_ =
                                               &req.sqls._M_string_length;
                                          req.sqls._M_dataplus._M_p = (pointer)0x0;
                                          local_88._M_local_buf[0] = '\0';
                                          req.sqls._M_string_length =
                                               req.sqls._M_string_length & 0xffffffffffffff00;
                                          req.sqls.field_2._8_8_ = local_1b0;
                                          local_1b8._M_p = (pointer)0x0;
                                          local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
                                          resp.code._M_dataplus._M_p = (pointer)paVar1;
                                          resp.message._M_dataplus._M_p = (pointer)paVar2;
                                          resp.success._M_dataplus._M_p = (pointer)paVar3;
                                          resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_258,"cn-hangzhou",
                                                     (allocator<char> *)&local_238);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_278,"my_appid",
                                                     (allocator<char> *)&local_2b8);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_298,"my_secret",&local_2b9);
                                          this = (CmsQueryListMetricRequestType *)
                                                 aliyun::Cms::CreateCmsClient
                                                           (local_258,local_278,local_298);
                                          std::__cxx11::string::~string(local_298);
                                          std::__cxx11::string::~string(local_278);
                                          std::__cxx11::string::~string(local_258);
                                          if (this == (CmsQueryListMetricRequestType *)0x0) {
                                            aliyun::CmsGetMetricStatisticsResponseType::
                                            ~CmsGetMetricStatisticsResponseType
                                                      ((CmsGetMetricStatisticsResponseType *)&req);
                                            aliyun::CmsGetMetricStatisticsRequestType::
                                            ~CmsGetMetricStatisticsRequestType
                                                      ((CmsGetMetricStatisticsRequestType *)&resp);
                                            req.project_name._M_dataplus._M_p =
                                                 (pointer)&req.project_name.field_2;
                                            req.project_name._M_string_length = 0;
                                            req.project_name.field_2._M_allocated_capacity =
                                                 req.project_name.field_2._M_allocated_capacity &
                                                 0xffffffffffffff00;
                                            req.metric_stream_name._M_dataplus._M_p =
                                                 (pointer)&req.metric_stream_name.field_2;
                                            req.metric_stream_name._M_string_length = 0;
                                            resp.code._M_string_length = 0;
                                            resp.code.field_2._M_allocated_capacity =
                                                 resp.code.field_2._M_allocated_capacity &
                                                 0xffffffffffffff00;
                                            resp.message._M_string_length = 0;
                                            resp.message.field_2._M_local_buf[0] = '\0';
                                            resp.success._M_string_length = 0;
                                            resp.success.field_2._M_local_buf[0] = '\0';
                                            resp.trace_id._M_string_length = 0;
                                            req.metric_stream_name.field_2._M_local_buf[0] = '\0';
                                            resp.trace_id.field_2._M_local_buf[0] = '\0';
                                            resp.result._M_dataplus._M_p =
                                                 (pointer)&resp.result.field_2;
                                            resp.result._M_string_length = 0;
                                            resp.result.field_2._M_local_buf[0] = '\0';
                                            resp.code._M_dataplus._M_p = (pointer)paVar1;
                                            resp.message._M_dataplus._M_p = (pointer)paVar2;
                                            resp.success._M_dataplus._M_p = (pointer)paVar3;
                                            resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_258,"cn-hangzhou",
                                                       (allocator<char> *)&local_238);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_278,"my_appid",
                                                       (allocator<char> *)&local_2b8);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_298,"my_secret",&local_2b9);
                                            this = (CmsQueryListMetricRequestType *)
                                                   aliyun::Cms::CreateCmsClient
                                                             (local_258,local_278,local_298);
                                            std::__cxx11::string::~string(local_298);
                                            std::__cxx11::string::~string(local_278);
                                            std::__cxx11::string::~string(local_258);
                                            if (this == (CmsQueryListMetricRequestType *)0x0) {
                                              aliyun::CmsGetMetricStreamResponseType::
                                              ~CmsGetMetricStreamResponseType
                                                        ((CmsGetMetricStreamResponseType *)&resp);
                                              aliyun::CmsGetMetricStreamRequestType::
                                              ~CmsGetMetricStreamRequestType
                                                        ((CmsGetMetricStreamRequestType *)&req);
                                              req.project_name._M_dataplus._M_p =
                                                   (pointer)&req.project_name.field_2;
                                              req.project_name._M_string_length = 0;
                                              req.project_name.field_2._M_allocated_capacity =
                                                   req.project_name.field_2._M_allocated_capacity &
                                                   0xffffffffffffff00;
                                              req.metric_stream_name._M_dataplus._M_p =
                                                   (pointer)&req.metric_stream_name.field_2;
                                              req.metric_stream_name._M_string_length = 0;
                                              resp.code._M_dataplus._M_p = (pointer)0x0;
                                              resp.code._M_string_length = 0;
                                              resp.code.field_2._M_allocated_capacity = 0;
                                              resp.code.field_2._8_8_ =
                                                   &resp.message._M_string_length;
                                              resp.message._M_dataplus._M_p = (pointer)0x0;
                                              resp.message._M_string_length =
                                                   resp.message._M_string_length &
                                                   0xffffffffffffff00;
                                              resp.message.field_2._8_8_ =
                                                   &resp.success._M_string_length;
                                              resp.success._M_dataplus._M_p = (pointer)0x0;
                                              resp.success._M_string_length =
                                                   resp.success._M_string_length &
                                                   0xffffffffffffff00;
                                              resp.success.field_2._8_8_ =
                                                   &resp.trace_id._M_string_length;
                                              resp.trace_id._M_dataplus._M_p = (pointer)0x0;
                                              req.metric_stream_name.field_2._M_local_buf[0] = '\0';
                                              resp.trace_id._M_string_length =
                                                   resp.trace_id._M_string_length &
                                                   0xffffffffffffff00;
                                              resp.trace_id.field_2._8_8_ =
                                                   &resp.result._M_string_length;
                                              resp.result._M_dataplus._M_p = (pointer)0x0;
                                              resp.result._M_string_length =
                                                   resp.result._M_string_length & 0xffffffffffffff00
                                              ;
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_258,"cn-hangzhou",
                                                         (allocator<char> *)&local_238);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_278,"my_appid",
                                                         (allocator<char> *)&local_2b8);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_298,"my_secret",&local_2b9);
                                              this = (CmsQueryListMetricRequestType *)
                                                     aliyun::Cms::CreateCmsClient
                                                               (local_258,local_278,local_298);
                                              std::__cxx11::string::~string(local_298);
                                              std::__cxx11::string::~string(local_278);
                                              std::__cxx11::string::~string(local_258);
                                              if (this == (CmsQueryListMetricRequestType *)0x0) {
                                                aliyun::CmsGetMetricStreamMetaResponseType::
                                                ~CmsGetMetricStreamMetaResponseType
                                                          ((CmsGetMetricStreamMetaResponseType *)
                                                           &resp);
                                                aliyun::CmsGetMetricStreamMetaRequestType::
                                                ~CmsGetMetricStreamMetaRequestType
                                                          ((CmsGetMetricStreamMetaRequestType *)&req
                                                          );
                                                req.project_name._M_dataplus._M_p =
                                                     (pointer)&req.project_name.field_2;
                                                req.project_name._M_string_length = 0;
                                                req.project_name.field_2._M_allocated_capacity =
                                                     req.project_name.field_2._M_allocated_capacity
                                                     & 0xffffffffffffff00;
                                                req.metric_stream_name._M_dataplus._M_p =
                                                     (pointer)&req.metric_stream_name.field_2;
                                                req.metric_stream_name._M_string_length = 0;
                                                resp.code._M_string_length = 0;
                                                resp.code.field_2._M_allocated_capacity =
                                                     resp.code.field_2._M_allocated_capacity &
                                                     0xffffffffffffff00;
                                                resp.message._M_string_length = 0;
                                                resp.message.field_2._M_local_buf[0] = '\0';
                                                resp.success._M_string_length = 0;
                                                req.metric_stream_name.field_2._M_local_buf[0] =
                                                     '\0';
                                                resp.success.field_2._M_local_buf[0] = '\0';
                                                resp.trace_id._M_string_length = 0;
                                                resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          (local_258,"cn-hangzhou",
                                                           (allocator<char> *)&local_238);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          (local_278,"my_appid",
                                                           (allocator<char> *)&local_2b8);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          (local_298,"my_secret",&local_2b9);
                                                this = (CmsQueryListMetricRequestType *)
                                                       aliyun::Cms::CreateCmsClient
                                                                 (local_258,local_278,local_298);
                                                std::__cxx11::string::~string(local_298);
                                                std::__cxx11::string::~string(local_278);
                                                std::__cxx11::string::~string(local_258);
                                                if (this == (CmsQueryListMetricRequestType *)0x0) {
                                                  aliyun::CmsGetMetricStreamStatusResponseType::
                                                  ~CmsGetMetricStreamStatusResponseType
                                                            ((CmsGetMetricStreamStatusResponseType *
                                                             )&resp);
                                                  aliyun::CmsGetMetricStreamStatusRequestType::
                                                  ~CmsGetMetricStreamStatusRequestType
                                                            ((CmsGetMetricStreamStatusRequestType *)
                                                             &req);
                                                  req.project_name._M_dataplus._M_p =
                                                       (pointer)&req.project_name.field_2;
                                                  req.project_name._M_string_length = 0;
                                                  resp.code._M_string_length = 0;
                                                  resp.code.field_2._M_allocated_capacity =
                                                       resp.code.field_2._M_allocated_capacity &
                                                       0xffffffffffffff00;
                                                  resp.message._M_string_length = 0;
                                                  resp.message.field_2._M_local_buf[0] = '\0';
                                                  resp.success._M_string_length = 0;
                                                  resp.success.field_2._M_local_buf[0] = '\0';
                                                  resp.trace_id._M_string_length = 0;
                                                  req.project_name.field_2._M_allocated_capacity =
                                                       req.project_name.field_2.
                                                       _M_allocated_capacity & 0xffffffffffffff00;
                                                  resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                  resp.result._M_dataplus._M_p =
                                                       (pointer)&resp.result.field_2;
                                                  resp.result._M_string_length = 0;
                                                  resp.result.field_2._M_local_buf[0] = '\0';
                                                  resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                  resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                  resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                  resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_258,"cn-hangzhou",
                                                             (allocator<char> *)&local_238);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_278,"my_appid",
                                                             (allocator<char> *)&local_2b8);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"my_secret",&local_2b9);
                                                  this = (CmsQueryListMetricRequestType *)
                                                         aliyun::Cms::CreateCmsClient
                                                                   (local_258,local_278,local_298);
                                                  std::__cxx11::string::~string(local_298);
                                                  std::__cxx11::string::~string(local_278);
                                                  std::__cxx11::string::~string(local_258);
                                                  if (this == (CmsQueryListMetricRequestType *)0x0)
                                                  {
                                                    aliyun::CmsGetProjectResponseType::
                                                    ~CmsGetProjectResponseType
                                                              ((CmsGetProjectResponseType *)&resp);
                                                    std::__cxx11::string::~string((string *)&req);
                                                    req.project_name._M_dataplus._M_p =
                                                         (pointer)&req.project_name.field_2;
                                                    req.project_name._M_string_length = 0;
                                                    req.project_name.field_2._M_allocated_capacity =
                                                         req.project_name.field_2.
                                                         _M_allocated_capacity & 0xffffffffffffff00;
                                                    req.metric_stream_name._M_dataplus._M_p =
                                                         (pointer)&req.metric_stream_name.field_2;
                                                    req.metric_stream_name._M_string_length = 0;
                                                    resp.code._M_string_length = 0;
                                                    resp.code.field_2._M_allocated_capacity =
                                                         resp.code.field_2._M_allocated_capacity &
                                                         0xffffffffffffff00;
                                                    resp.message._M_string_length = 0;
                                                    resp.message.field_2._M_local_buf[0] = '\0';
                                                    resp.success._M_string_length = 0;
                                                    resp.success.field_2._M_local_buf[0] = '\0';
                                                    resp.trace_id._M_string_length = 0;
                                                    req.metric_stream_name.field_2._M_local_buf[0] =
                                                         '\0';
                                                    resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                    resp.result._M_dataplus._M_p =
                                                         (pointer)&resp.result.field_2;
                                                    resp.result._M_string_length = 0;
                                                    resp.result.field_2._M_local_buf[0] = '\0';
                                                    resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                    resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                    resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                    resp.trace_id._M_dataplus._M_p = (pointer)paVar4
                                                    ;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_258,"cn-hangzhou",
                                                               (allocator<char> *)&local_238);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_278,"my_appid",
                                                               (allocator<char> *)&local_2b8);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_298,"my_secret",&local_2b9);
                                                    this = (CmsQueryListMetricRequestType *)
                                                           aliyun::Cms::CreateCmsClient
                                                                     (local_258,local_278,local_298)
                                                    ;
                                                    std::__cxx11::string::~string(local_298);
                                                    std::__cxx11::string::~string(local_278);
                                                    std::__cxx11::string::~string(local_258);
                                                    if (this == (CmsQueryListMetricRequestType *)0x0
                                                       ) {
                                                      aliyun::CmsGetSQLMetricsResponseType::
                                                      ~CmsGetSQLMetricsResponseType
                                                                ((CmsGetSQLMetricsResponseType *)
                                                                 &resp);
                                                      aliyun::CmsGetSQLMetricsRequestType::
                                                      ~CmsGetSQLMetricsRequestType
                                                                ((CmsGetSQLMetricsRequestType *)&req
                                                                );
                                                      req.project_name._M_dataplus._M_p =
                                                           (pointer)&req.project_name.field_2;
                                                      req.project_name._M_string_length = 0;
                                                      req.project_name.field_2._M_allocated_capacity
                                                           = req.project_name.field_2.
                                                             _M_allocated_capacity &
                                                             0xffffffffffffff00;
                                                      req.metric_stream_name._M_dataplus._M_p =
                                                           (pointer)&req.metric_stream_name.field_2;
                                                      req.metric_stream_name._M_string_length = 0;
                                                      req.metric_stream_name.field_2._M_local_buf[0]
                                                           = '\0';
                                                      req.sqls._M_dataplus._M_p =
                                                           (pointer)&req.sqls.field_2;
                                                      req.sqls._M_string_length = 0;
                                                      resp.code._M_dataplus._M_p = (pointer)0x0;
                                                      resp.code._M_string_length = 0;
                                                      resp.code.field_2._M_allocated_capacity = 0;
                                                      resp.code.field_2._8_8_ =
                                                           &resp.message._M_string_length;
                                                      resp.message._M_dataplus._M_p = (pointer)0x0;
                                                      resp.message._M_string_length =
                                                           resp.message._M_string_length &
                                                           0xffffffffffffff00;
                                                      resp.message.field_2._8_8_ =
                                                           &resp.success._M_string_length;
                                                      resp.success._M_dataplus._M_p = (pointer)0x0;
                                                      resp.success._M_string_length =
                                                           resp.success._M_string_length &
                                                           0xffffffffffffff00;
                                                      resp.success.field_2._8_8_ =
                                                           &resp.trace_id._M_string_length;
                                                      resp.trace_id._M_dataplus._M_p = (pointer)0x0;
                                                      req.sqls.field_2._M_local_buf[0] = '\0';
                                                      resp.trace_id._M_string_length =
                                                           resp.trace_id._M_string_length &
                                                           0xffffffffffffff00;
                                                      resp.trace_id.field_2._8_8_ =
                                                           &resp.result._M_string_length;
                                                      resp.result._M_dataplus._M_p = (pointer)0x0;
                                                      resp.result._M_string_length =
                                                           resp.result._M_string_length &
                                                           0xffffffffffffff00;
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_258,"cn-hangzhou",
                                                                 (allocator<char> *)&local_238);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_278,"my_appid",
                                                                 (allocator<char> *)&local_2b8);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_298,"my_secret",&local_2b9);
                                                      this = (CmsQueryListMetricRequestType *)
                                                             aliyun::Cms::CreateCmsClient
                                                                       (local_258,local_278,
                                                                        local_298);
                                                      std::__cxx11::string::~string(local_298);
                                                      std::__cxx11::string::~string(local_278);
                                                      std::__cxx11::string::~string(local_258);
                                                      if (this == (CmsQueryListMetricRequestType *)
                                                                  0x0) {
                                                        aliyun::CmsListDimTableResponseType::
                                                        ~CmsListDimTableResponseType
                                                                  ((CmsListDimTableResponseType *)
                                                                   &resp);
                                                        aliyun::CmsListDimTableRequestType::
                                                        ~CmsListDimTableRequestType
                                                                  ((CmsListDimTableRequestType *)
                                                                   &req);
                                                        req.project_name._M_dataplus._M_p =
                                                             (pointer)&req.project_name.field_2;
                                                        req.project_name._M_string_length = 0;
                                                        req.project_name.field_2.
                                                        _M_allocated_capacity =
                                                             req.project_name.field_2.
                                                             _M_allocated_capacity &
                                                             0xffffffffffffff00;
                                                        req.metric_stream_name._M_dataplus._M_p =
                                                             (pointer)&req.metric_stream_name.
                                                                       field_2;
                                                        req.metric_stream_name._M_string_length = 0;
                                                        resp.code._M_string_length = 0;
                                                        resp.code.field_2._M_allocated_capacity =
                                                             resp.code.field_2._M_allocated_capacity
                                                             & 0xffffffffffffff00;
                                                        resp.message._M_string_length = 0;
                                                        resp.message.field_2._M_local_buf[0] = '\0';
                                                        resp.success._M_string_length = 0;
                                                        resp.success.field_2._M_local_buf[0] = '\0';
                                                        resp.trace_id._M_string_length = 0;
                                                        req.metric_stream_name.field_2._M_local_buf
                                                        [0] = '\0';
                                                        resp.trace_id.field_2._M_local_buf[0] = '\0'
                                                        ;
                                                        resp.result._M_dataplus._M_p =
                                                             (pointer)&resp.result.field_2;
                                                        resp.result._M_string_length = 0;
                                                        resp.result.field_2._M_local_buf[0] = '\0';
                                                        resp.code._M_dataplus._M_p = (pointer)paVar1
                                                        ;
                                                        resp.message._M_dataplus._M_p =
                                                             (pointer)paVar2;
                                                        resp.success._M_dataplus._M_p =
                                                             (pointer)paVar3;
                                                        resp.trace_id._M_dataplus._M_p =
                                                             (pointer)paVar4;
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_258,"cn-hangzhou",
                                                                   (allocator<char> *)&local_238);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_278,"my_appid",
                                                                   (allocator<char> *)&local_2b8);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_298,"my_secret",&local_2b9)
                                                        ;
                                                        this = (CmsQueryListMetricRequestType *)
                                                               aliyun::Cms::CreateCmsClient
                                                                         (local_258,local_278,
                                                                          local_298);
                                                        std::__cxx11::string::~string(local_298);
                                                        std::__cxx11::string::~string(local_278);
                                                        std::__cxx11::string::~string(local_258);
                                                        if (this == (CmsQueryListMetricRequestType *
                                                                    )0x0) {
                                                          aliyun::CmsListDimTableDataResponseType::
                                                          ~CmsListDimTableDataResponseType
                                                                    ((
                                                  CmsListDimTableDataResponseType *)&resp);
                                                  aliyun::CmsListDimTableDataRequestType::
                                                  ~CmsListDimTableDataRequestType
                                                            ((CmsListDimTableDataRequestType *)&req)
                                                  ;
                                                  resp.code._M_string_length = 0;
                                                  resp.code.field_2._M_allocated_capacity =
                                                       resp.code.field_2._M_allocated_capacity &
                                                       0xffffffffffffff00;
                                                  resp.message._M_string_length = 0;
                                                  resp.message.field_2._M_local_buf[0] = '\0';
                                                  resp.success._M_string_length = 0;
                                                  resp.success.field_2._M_local_buf[0] = '\0';
                                                  resp.trace_id._M_string_length = 0;
                                                  resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                  resp.result._M_dataplus._M_p =
                                                       (pointer)&resp.result.field_2;
                                                  resp.result._M_string_length = 0;
                                                  req.project_name._M_dataplus._M_p = (pointer)0x0;
                                                  req.project_name._M_string_length = 0;
                                                  req.project_name.field_2._M_allocated_capacity = 0
                                                  ;
                                                  req.project_name.field_2._8_8_ =
                                                       &req.metric_stream_name._M_string_length;
                                                  req.metric_stream_name._M_dataplus._M_p =
                                                       (pointer)0x0;
                                                  req.metric_stream_name._M_string_length =
                                                       req.metric_stream_name._M_string_length &
                                                       0xffffffffffffff00;
                                                  req.metric_stream_name.field_2._8_8_ =
                                                       &req.sqls._M_string_length;
                                                  req.sqls._M_dataplus._M_p = (pointer)0x0;
                                                  req.sqls._M_string_length =
                                                       req.sqls._M_string_length &
                                                       0xffffffffffffff00;
                                                  req.sqls.field_2._8_8_ = local_1b0;
                                                  local_1b8._M_p = (pointer)0x0;
                                                  resp.result.field_2._M_local_buf[0] = '\0';
                                                  local_1b0._0_8_ =
                                                       local_1b0._0_8_ & 0xffffffffffffff00;
                                                  local_1b0._16_8_ = &local_190;
                                                  local_198._M_p = (pointer)0x0;
                                                  local_190._M_local_buf[0] = '\0';
                                                  resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                  resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                  resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                  resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_258,"cn-hangzhou",
                                                             (allocator<char> *)&local_238);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_278,"my_appid",
                                                             (allocator<char> *)&local_2b8);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"my_secret",&local_2b9);
                                                  this = (CmsQueryListMetricRequestType *)
                                                         aliyun::Cms::CreateCmsClient
                                                                   (local_258,local_278,local_298);
                                                  std::__cxx11::string::~string(local_298);
                                                  std::__cxx11::string::~string(local_278);
                                                  std::__cxx11::string::~string(local_258);
                                                  if (this == (CmsQueryListMetricRequestType *)0x0)
                                                  {
                                                    aliyun::CmsListMetricsResponseType::
                                                    ~CmsListMetricsResponseType
                                                              ((CmsListMetricsResponseType *)&req);
                                                    aliyun::CmsListMetricsRequestType::
                                                    ~CmsListMetricsRequestType
                                                              ((CmsListMetricsRequestType *)&resp);
                                                    resp.code._M_string_length = 0;
                                                    resp.code.field_2._M_allocated_capacity =
                                                         resp.code.field_2._M_allocated_capacity &
                                                         0xffffffffffffff00;
                                                    resp.message._M_string_length = 0;
                                                    resp.message.field_2._M_local_buf[0] = '\0';
                                                    resp.success._M_string_length = 0;
                                                    resp.success.field_2._M_local_buf[0] = '\0';
                                                    resp.trace_id._M_string_length = 0;
                                                    resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                    resp.result._M_dataplus._M_p =
                                                         (pointer)&resp.result.field_2;
                                                    resp.result._M_string_length = 0;
                                                    req.project_name._M_dataplus._M_p = (pointer)0x0
                                                    ;
                                                    req.project_name._M_string_length = 0;
                                                    req.project_name.field_2._M_allocated_capacity =
                                                         0;
                                                    req.project_name.field_2._8_8_ =
                                                         &req.metric_stream_name._M_string_length;
                                                    req.metric_stream_name._M_dataplus._M_p =
                                                         (pointer)0x0;
                                                    req.metric_stream_name._M_string_length =
                                                         req.metric_stream_name._M_string_length &
                                                         0xffffffffffffff00;
                                                    req.metric_stream_name.field_2._8_8_ =
                                                         &req.sqls._M_string_length;
                                                    req.sqls._M_dataplus._M_p = (pointer)0x0;
                                                    req.sqls._M_string_length =
                                                         req.sqls._M_string_length &
                                                         0xffffffffffffff00;
                                                    req.sqls.field_2._8_8_ = local_1b0;
                                                    local_1b8._M_p = (pointer)0x0;
                                                    resp.result.field_2._M_local_buf[0] = '\0';
                                                    local_1b0._0_8_ =
                                                         local_1b0._0_8_ & 0xffffffffffffff00;
                                                    local_1b0._16_8_ = &local_190;
                                                    local_198._M_p = (pointer)0x0;
                                                    local_190._M_local_buf[0] = '\0';
                                                    resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                    resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                    resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                    resp.trace_id._M_dataplus._M_p = (pointer)paVar4
                                                    ;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_258,"cn-hangzhou",
                                                               (allocator<char> *)&local_238);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_278,"my_appid",
                                                               (allocator<char> *)&local_2b8);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_298,"my_secret",&local_2b9);
                                                    this = (CmsQueryListMetricRequestType *)
                                                           aliyun::Cms::CreateCmsClient
                                                                     (local_258,local_278,local_298)
                                                    ;
                                                    std::__cxx11::string::~string(local_298);
                                                    std::__cxx11::string::~string(local_278);
                                                    std::__cxx11::string::~string(local_258);
                                                    if (this == (CmsQueryListMetricRequestType *)0x0
                                                       ) {
                                                      aliyun::CmsListMetricsPlanResponseType::
                                                      ~CmsListMetricsPlanResponseType
                                                                ((CmsListMetricsPlanResponseType *)
                                                                 &req);
                                                      aliyun::CmsListMetricsPlanRequestType::
                                                      ~CmsListMetricsPlanRequestType
                                                                ((CmsListMetricsPlanRequestType *)
                                                                 &resp);
                                                      req.project_name._M_dataplus._M_p =
                                                           (pointer)&req.project_name.field_2;
                                                      req.project_name._M_string_length = 0;
                                                      req.project_name.field_2._M_allocated_capacity
                                                           = req.project_name.field_2.
                                                             _M_allocated_capacity &
                                                             0xffffffffffffff00;
                                                      req.metric_stream_name._M_dataplus._M_p =
                                                           (pointer)&req.metric_stream_name.field_2;
                                                      req.metric_stream_name._M_string_length = 0;
                                                      req.metric_stream_name.field_2._M_local_buf[0]
                                                           = '\0';
                                                      req.sqls._M_dataplus._M_p =
                                                           (pointer)&req.sqls.field_2;
                                                      req.sqls._M_string_length = 0;
                                                      req.sqls.field_2._M_local_buf[0] = '\0';
                                                      local_1b8._M_p = local_1b0 + 8;
                                                      local_1b0._0_8_ = 0;
                                                      resp.code._M_dataplus._M_p = (pointer)0x0;
                                                      resp.code._M_string_length = 0;
                                                      resp.code.field_2._M_allocated_capacity = 0;
                                                      resp.code.field_2._8_8_ =
                                                           &resp.message._M_string_length;
                                                      resp.message._M_dataplus._M_p = (pointer)0x0;
                                                      resp.message._M_string_length =
                                                           resp.message._M_string_length &
                                                           0xffffffffffffff00;
                                                      resp.message.field_2._8_8_ =
                                                           &resp.success._M_string_length;
                                                      resp.success._M_dataplus._M_p = (pointer)0x0;
                                                      resp.success._M_string_length =
                                                           resp.success._M_string_length &
                                                           0xffffffffffffff00;
                                                      resp.success.field_2._8_8_ =
                                                           &resp.trace_id._M_string_length;
                                                      resp.trace_id._M_dataplus._M_p = (pointer)0x0;
                                                      local_1b0[8] = '\0';
                                                      resp.trace_id._M_string_length =
                                                           resp.trace_id._M_string_length &
                                                           0xffffffffffffff00;
                                                      resp.trace_id.field_2._8_8_ =
                                                           &resp.result._M_string_length;
                                                      resp.result._M_dataplus._M_p = (pointer)0x0;
                                                      resp.result._M_string_length =
                                                           resp.result._M_string_length &
                                                           0xffffffffffffff00;
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_258,"cn-hangzhou",
                                                                 (allocator<char> *)&local_238);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_278,"my_appid",
                                                                 (allocator<char> *)&local_2b8);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_298,"my_secret",&local_2b9);
                                                      this = (CmsQueryListMetricRequestType *)
                                                             aliyun::Cms::CreateCmsClient
                                                                       (local_258,local_278,
                                                                        local_298);
                                                      std::__cxx11::string::~string(local_298);
                                                      std::__cxx11::string::~string(local_278);
                                                      std::__cxx11::string::~string(local_258);
                                                      if (this == (CmsQueryListMetricRequestType *)
                                                                  0x0) {
                                                        aliyun::CmsListMetricStreamResponseType::
                                                        ~CmsListMetricStreamResponseType
                                                                  ((CmsListMetricStreamResponseType
                                                                    *)&resp);
                                                        aliyun::CmsListMetricStreamRequestType::
                                                        ~CmsListMetricStreamRequestType
                                                                  ((CmsListMetricStreamRequestType *
                                                                   )&req);
                                                        req.project_name._M_dataplus._M_p =
                                                             (pointer)&req.project_name.field_2;
                                                        req.project_name._M_string_length = 0;
                                                        req.project_name.field_2.
                                                        _M_allocated_capacity =
                                                             req.project_name.field_2.
                                                             _M_allocated_capacity &
                                                             0xffffffffffffff00;
                                                        req.metric_stream_name._M_dataplus._M_p =
                                                             (pointer)&req.metric_stream_name.
                                                                       field_2;
                                                        req.metric_stream_name._M_string_length = 0;
                                                        req.metric_stream_name.field_2._M_local_buf
                                                        [0] = '\0';
                                                        req.sqls._M_dataplus._M_p =
                                                             (pointer)&req.sqls.field_2;
                                                        req.sqls._M_string_length = 0;
                                                        resp.code._M_dataplus._M_p = (pointer)0x0;
                                                        resp.code._M_string_length = 0;
                                                        resp.code.field_2._M_allocated_capacity = 0;
                                                        resp.code.field_2._8_8_ =
                                                             &resp.message._M_string_length;
                                                        resp.message._M_dataplus._M_p = (pointer)0x0
                                                        ;
                                                        resp.message._M_string_length =
                                                             resp.message._M_string_length &
                                                             0xffffffffffffff00;
                                                        resp.message.field_2._8_8_ =
                                                             &resp.success._M_string_length;
                                                        resp.success._M_dataplus._M_p = (pointer)0x0
                                                        ;
                                                        resp.success._M_string_length =
                                                             resp.success._M_string_length &
                                                             0xffffffffffffff00;
                                                        resp.success.field_2._8_8_ =
                                                             &resp.trace_id._M_string_length;
                                                        resp.trace_id._M_dataplus._M_p =
                                                             (pointer)0x0;
                                                        req.sqls.field_2._M_local_buf[0] = '\0';
                                                        resp.trace_id._M_string_length =
                                                             resp.trace_id._M_string_length &
                                                             0xffffffffffffff00;
                                                        resp.trace_id.field_2._8_8_ =
                                                             &resp.result._M_string_length;
                                                        resp.result._M_dataplus._M_p = (pointer)0x0;
                                                        resp.result._M_string_length =
                                                             resp.result._M_string_length &
                                                             0xffffffffffffff00;
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_258,"cn-hangzhou",
                                                                   (allocator<char> *)&local_238);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_278,"my_appid",
                                                                   (allocator<char> *)&local_2b8);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_298,"my_secret",&local_2b9)
                                                        ;
                                                        this = (CmsQueryListMetricRequestType *)
                                                               aliyun::Cms::CreateCmsClient
                                                                         (local_258,local_278,
                                                                          local_298);
                                                        std::__cxx11::string::~string(local_298);
                                                        std::__cxx11::string::~string(local_278);
                                                        std::__cxx11::string::~string(local_258);
                                                        if (this == (CmsQueryListMetricRequestType *
                                                                    )0x0) {
                                                          aliyun::CmsListProjectResponseType::
                                                          ~CmsListProjectResponseType
                                                                    ((CmsListProjectResponseType *)
                                                                     &resp);
                                                          aliyun::CmsListProjectRequestType::
                                                          ~CmsListProjectRequestType
                                                                    ((CmsListProjectRequestType *)
                                                                     &req);
                                                          req.project_name._M_dataplus._M_p =
                                                               (pointer)&req.project_name.field_2;
                                                          req.project_name._M_string_length = 0;
                                                          req.project_name.field_2.
                                                          _M_allocated_capacity =
                                                               req.project_name.field_2.
                                                               _M_allocated_capacity &
                                                               0xffffffffffffff00;
                                                          req.metric_stream_name._M_dataplus._M_p =
                                                               (pointer)&req.metric_stream_name.
                                                                         field_2;
                                                          req.metric_stream_name._M_string_length =
                                                               0;
                                                          req.metric_stream_name.field_2.
                                                          _M_local_buf[0] = '\0';
                                                          req.sqls._M_dataplus._M_p =
                                                               (pointer)&req.sqls.field_2;
                                                          req.sqls._M_string_length = 0;
                                                          req.sqls.field_2._M_local_buf[0] = '\0';
                                                          local_1b8._M_p = local_1b0 + 8;
                                                          local_1b0._0_8_ = 0;
                                                          resp.code._M_dataplus._M_p = (pointer)0x0;
                                                          resp.code._M_string_length = 0;
                                                          resp.code.field_2._M_allocated_capacity =
                                                               0;
                                                          resp.code.field_2._8_8_ =
                                                               &resp.message._M_string_length;
                                                          resp.message._M_dataplus._M_p =
                                                               (pointer)0x0;
                                                          resp.message._M_string_length =
                                                               resp.message._M_string_length &
                                                               0xffffffffffffff00;
                                                          resp.message.field_2._8_8_ =
                                                               &resp.success._M_string_length;
                                                          resp.success._M_dataplus._M_p =
                                                               (pointer)0x0;
                                                          resp.success._M_string_length =
                                                               resp.success._M_string_length &
                                                               0xffffffffffffff00;
                                                          resp.success.field_2._8_8_ =
                                                               &resp.trace_id._M_string_length;
                                                          resp.trace_id._M_dataplus._M_p =
                                                               (pointer)0x0;
                                                          local_1b0[8] = '\0';
                                                          resp.trace_id._M_string_length =
                                                               resp.trace_id._M_string_length &
                                                               0xffffffffffffff00;
                                                          resp.trace_id.field_2._8_8_ =
                                                               &resp.result._M_string_length;
                                                          resp.result._M_dataplus._M_p =
                                                               (pointer)0x0;
                                                          resp.result._M_string_length =
                                                               resp.result._M_string_length &
                                                               0xffffffffffffff00;
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_258,"cn-hangzhou",
                                                                     (allocator<char> *)&local_238);
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_278,"my_appid",
                                                                     (allocator<char> *)&local_2b8);
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_298,"my_secret",
                                                                     &local_2b9);
                                                          this = (CmsQueryListMetricRequestType *)
                                                                 aliyun::Cms::CreateCmsClient
                                                                           (local_258,local_278,
                                                                            local_298);
                                                          std::__cxx11::string::~string(local_298);
                                                          std::__cxx11::string::~string(local_278);
                                                          std::__cxx11::string::~string(local_258);
                                                          if (this == (CmsQueryListMetricRequestType
                                                                       *)0x0) {
                                                            aliyun::CmsListSQLMetricsResponseType::
                                                            ~CmsListSQLMetricsResponseType
                                                                      ((
                                                  CmsListSQLMetricsResponseType *)&resp);
                                                  aliyun::CmsListSQLMetricsRequestType::
                                                  ~CmsListSQLMetricsRequestType
                                                            ((CmsListSQLMetricsRequestType *)&req);
                                                  req.project_name._M_dataplus._M_p =
                                                       (pointer)&req.project_name.field_2;
                                                  req.project_name._M_string_length = 0;
                                                  req.project_name.field_2._M_allocated_capacity =
                                                       req.project_name.field_2.
                                                       _M_allocated_capacity & 0xffffffffffffff00;
                                                  req.metric_stream_name._M_dataplus._M_p =
                                                       (pointer)&req.metric_stream_name.field_2;
                                                  req.metric_stream_name._M_string_length = 0;
                                                  resp.code._M_string_length = 0;
                                                  resp.code.field_2._M_allocated_capacity =
                                                       resp.code.field_2._M_allocated_capacity &
                                                       0xffffffffffffff00;
                                                  resp.message._M_string_length = 0;
                                                  resp.message.field_2._M_local_buf[0] = '\0';
                                                  resp.success._M_string_length = 0;
                                                  req.metric_stream_name.field_2._M_local_buf[0] =
                                                       '\0';
                                                  resp.success.field_2._M_local_buf[0] = '\0';
                                                  resp.trace_id._M_string_length = 0;
                                                  resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                  resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                  resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                  resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                  resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_258,"cn-hangzhou",
                                                             (allocator<char> *)&local_238);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_278,"my_appid",
                                                             (allocator<char> *)&local_2b8);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"my_secret",&local_2b9);
                                                  this = (CmsQueryListMetricRequestType *)
                                                         aliyun::Cms::CreateCmsClient
                                                                   (local_258,local_278,local_298);
                                                  std::__cxx11::string::~string(local_298);
                                                  std::__cxx11::string::~string(local_278);
                                                  std::__cxx11::string::~string(local_258);
                                                  if (this == (CmsQueryListMetricRequestType *)0x0)
                                                  {
                                                    aliyun::CmsPutDimTableDataResponseType::
                                                    ~CmsPutDimTableDataResponseType
                                                              ((CmsPutDimTableDataResponseType *)
                                                               &resp);
                                                    aliyun::CmsPutDimTableDataRequestType::
                                                    ~CmsPutDimTableDataRequestType
                                                              ((CmsPutDimTableDataRequestType *)&req
                                                              );
                                                    resp.code._M_string_length = 0;
                                                    resp.code.field_2._M_allocated_capacity =
                                                         resp.code.field_2._M_allocated_capacity &
                                                         0xffffffffffffff00;
                                                    resp.message._M_string_length = 0;
                                                    resp.message.field_2._M_local_buf[0] = '\0';
                                                    resp.success._M_string_length = 0;
                                                    resp.success.field_2._M_local_buf[0] = '\0';
                                                    resp.trace_id._M_string_length = 0;
                                                    resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                    resp.result._M_dataplus._M_p =
                                                         (pointer)&resp.result.field_2;
                                                    resp.result._M_string_length = 0;
                                                    resp.result.field_2._M_local_buf[0] = '\0';
                                                    local_d8._M_p = (pointer)&local_c8;
                                                    local_d0 = 0;
                                                    local_c8._M_local_buf[0] = '\0';
                                                    local_b8._M_p = (pointer)&local_a8;
                                                    local_b0 = 0;
                                                    local_a8._M_local_buf[0] = '\0';
                                                    local_98._M_p = (pointer)&local_88;
                                                    local_90 = 0;
                                                    local_88._M_local_buf[0] = '\0';
                                                    local_78._M_p = (pointer)&local_68;
                                                    local_70 = 0;
                                                    req.project_name._M_dataplus._M_p = (pointer)0x0
                                                    ;
                                                    req.project_name._M_string_length = 0;
                                                    req.project_name.field_2._M_allocated_capacity =
                                                         0;
                                                    req.project_name.field_2._8_8_ =
                                                         &req.metric_stream_name._M_string_length;
                                                    req.metric_stream_name._M_dataplus._M_p =
                                                         (pointer)0x0;
                                                    req.metric_stream_name._M_string_length =
                                                         req.metric_stream_name._M_string_length &
                                                         0xffffffffffffff00;
                                                    req.metric_stream_name.field_2._8_8_ =
                                                         &req.sqls._M_string_length;
                                                    req.sqls._M_dataplus._M_p = (pointer)0x0;
                                                    req.sqls._M_string_length =
                                                         req.sqls._M_string_length &
                                                         0xffffffffffffff00;
                                                    req.sqls.field_2._8_8_ = local_1b0;
                                                    local_1b8._M_p = (pointer)0x0;
                                                    local_68._M_local_buf[0] = '\0';
                                                    local_1b0._0_8_ =
                                                         local_1b0._0_8_ & 0xffffffffffffff00;
                                                    local_1b0._16_8_ = &local_190;
                                                    local_198._M_p = (pointer)0x0;
                                                    local_190._M_local_buf[0] = '\0';
                                                    resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                    resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                    resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                    resp.trace_id._M_dataplus._M_p = (pointer)paVar4
                                                    ;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_258,"cn-hangzhou",
                                                               (allocator<char> *)&local_238);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_278,"my_appid",
                                                               (allocator<char> *)&local_2b8);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_298,"my_secret",&local_2b9);
                                                    this = (CmsQueryListMetricRequestType *)
                                                           aliyun::Cms::CreateCmsClient
                                                                     (local_258,local_278,local_298)
                                                    ;
                                                    std::__cxx11::string::~string(local_298);
                                                    std::__cxx11::string::~string(local_278);
                                                    std::__cxx11::string::~string(local_258);
                                                    if (this == (CmsQueryListMetricRequestType *)0x0
                                                       ) {
                                                      aliyun::CmsQueryIncrementalResponseType::
                                                      ~CmsQueryIncrementalResponseType
                                                                ((CmsQueryIncrementalResponseType *)
                                                                 &req);
                                                      aliyun::CmsQueryIncrementalRequestType::
                                                      ~CmsQueryIncrementalRequestType
                                                                ((CmsQueryIncrementalRequestType *)
                                                                 &resp);
                                                      resp.code._M_string_length = 0;
                                                      resp.code.field_2._M_allocated_capacity =
                                                           resp.code.field_2._M_allocated_capacity &
                                                           0xffffffffffffff00;
                                                      resp.message._M_string_length = 0;
                                                      resp.message.field_2._M_local_buf[0] = '\0';
                                                      resp.success._M_string_length = 0;
                                                      resp.success.field_2._M_local_buf[0] = '\0';
                                                      resp.trace_id._M_string_length = 0;
                                                      resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                      resp.result._M_dataplus._M_p =
                                                           (pointer)&resp.result.field_2;
                                                      resp.result._M_string_length = 0;
                                                      resp.result.field_2._M_local_buf[0] = '\0';
                                                      local_d8._M_p = (pointer)&local_c8;
                                                      local_d0 = 0;
                                                      local_c8._M_local_buf[0] = '\0';
                                                      local_b8._M_p = (pointer)&local_a8;
                                                      local_b0 = 0;
                                                      local_a8._M_local_buf[0] = '\0';
                                                      local_98._M_p = (pointer)&local_88;
                                                      local_90 = 0;
                                                      local_88._M_local_buf[0] = '\0';
                                                      local_78._M_p = (pointer)&local_68;
                                                      local_70 = 0;
                                                      local_68._M_local_buf[0] = '\0';
                                                      local_58._M_p = (pointer)&local_48;
                                                      local_50 = 0;
                                                      req.project_name._M_dataplus._M_p =
                                                           (pointer)0x0;
                                                      req.project_name._M_string_length = 0;
                                                      req.project_name.field_2._M_allocated_capacity
                                                           = 0;
                                                      req.project_name.field_2._8_8_ =
                                                           &req.metric_stream_name._M_string_length;
                                                      req.metric_stream_name._M_dataplus._M_p =
                                                           (pointer)0x0;
                                                      req.metric_stream_name._M_string_length =
                                                           req.metric_stream_name._M_string_length &
                                                           0xffffffffffffff00;
                                                      req.metric_stream_name.field_2._8_8_ =
                                                           &req.sqls._M_string_length;
                                                      req.sqls._M_dataplus._M_p = (pointer)0x0;
                                                      req.sqls._M_string_length =
                                                           req.sqls._M_string_length &
                                                           0xffffffffffffff00;
                                                      req.sqls.field_2._8_8_ = local_1b0;
                                                      local_1b8._M_p = (pointer)0x0;
                                                      local_48._M_local_buf[0] = '\0';
                                                      local_1b0._0_8_ =
                                                           local_1b0._0_8_ & 0xffffffffffffff00;
                                                      local_1b0._16_8_ = &local_190;
                                                      local_198._M_p = (pointer)0x0;
                                                      local_190._M_local_buf[0] = '\0';
                                                      resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                      resp.message._M_dataplus._M_p =
                                                           (pointer)paVar2;
                                                      resp.success._M_dataplus._M_p =
                                                           (pointer)paVar3;
                                                      resp.trace_id._M_dataplus._M_p =
                                                           (pointer)paVar4;
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_258,"cn-hangzhou",
                                                                 (allocator<char> *)&local_238);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_278,"my_appid",
                                                                 (allocator<char> *)&local_2b8);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_298,"my_secret",&local_2b9);
                                                      this = (CmsQueryListMetricRequestType *)
                                                             aliyun::Cms::CreateCmsClient
                                                                       (local_258,local_278,
                                                                        local_298);
                                                      std::__cxx11::string::~string(local_298);
                                                      std::__cxx11::string::~string(local_278);
                                                      std::__cxx11::string::~string(local_258);
                                                      if (this == (CmsQueryListMetricRequestType *)
                                                                  0x0) {
                                                        aliyun::CmsQueryListMetricResponseType::
                                                        ~CmsQueryListMetricResponseType
                                                                  ((CmsQueryListMetricResponseType *
                                                                   )&req);
                                                        aliyun::CmsQueryListMetricRequestType::
                                                        ~CmsQueryListMetricRequestType
                                                                  ((CmsQueryListMetricRequestType *)
                                                                   &resp);
                                                        resp.code._M_string_length = 0;
                                                        resp.code.field_2._M_allocated_capacity =
                                                             resp.code.field_2._M_allocated_capacity
                                                             & 0xffffffffffffff00;
                                                        resp.message._M_string_length = 0;
                                                        resp.message.field_2._M_local_buf[0] = '\0';
                                                        resp.success._M_string_length = 0;
                                                        resp.success.field_2._M_local_buf[0] = '\0';
                                                        resp.trace_id._M_string_length = 0;
                                                        resp.trace_id.field_2._M_local_buf[0] = '\0'
                                                        ;
                                                        resp.result._M_dataplus._M_p =
                                                             (pointer)&resp.result.field_2;
                                                        resp.result._M_string_length = 0;
                                                        resp.result.field_2._M_local_buf[0] = '\0';
                                                        local_d8._M_p = (pointer)&local_c8;
                                                        local_d0 = 0;
                                                        local_c8._M_local_buf[0] = '\0';
                                                        local_b8._M_p = (pointer)&local_a8;
                                                        local_b0 = 0;
                                                        local_a8._M_local_buf[0] = '\0';
                                                        local_98._M_p = (pointer)&local_88;
                                                        local_90 = 0;
                                                        local_88._M_local_buf[0] = '\0';
                                                        local_78._M_p = (pointer)&local_68;
                                                        local_70 = 0;
                                                        req.project_name._M_dataplus._M_p =
                                                             (pointer)0x0;
                                                        req.project_name._M_string_length = 0;
                                                        req.project_name.field_2.
                                                        _M_allocated_capacity = 0;
                                                        req.project_name.field_2._8_8_ =
                                                             &req.metric_stream_name.
                                                              _M_string_length;
                                                        req.metric_stream_name._M_dataplus._M_p =
                                                             (pointer)0x0;
                                                        req.metric_stream_name._M_string_length =
                                                             req.metric_stream_name._M_string_length
                                                             & 0xffffffffffffff00;
                                                        req.metric_stream_name.field_2._8_8_ =
                                                             &req.sqls._M_string_length;
                                                        req.sqls._M_dataplus._M_p = (pointer)0x0;
                                                        req.sqls._M_string_length =
                                                             req.sqls._M_string_length &
                                                             0xffffffffffffff00;
                                                        req.sqls.field_2._8_8_ = local_1b0;
                                                        local_1b8._M_p = (pointer)0x0;
                                                        local_68._M_local_buf[0] = '\0';
                                                        local_1b0._0_8_ =
                                                             local_1b0._0_8_ & 0xffffffffffffff00;
                                                        local_1b0._16_8_ = &local_190;
                                                        local_198._M_p = (pointer)0x0;
                                                        local_190._M_local_buf[0] = '\0';
                                                        resp.code._M_dataplus._M_p = (pointer)paVar1
                                                        ;
                                                        resp.message._M_dataplus._M_p =
                                                             (pointer)paVar2;
                                                        resp.success._M_dataplus._M_p =
                                                             (pointer)paVar3;
                                                        resp.trace_id._M_dataplus._M_p =
                                                             (pointer)paVar4;
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_258,"cn-hangzhou",
                                                                   (allocator<char> *)&local_238);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_278,"my_appid",
                                                                   (allocator<char> *)&local_2b8);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_298,"my_secret",&local_2b9)
                                                        ;
                                                        this = (CmsQueryListMetricRequestType *)
                                                               aliyun::Cms::CreateCmsClient
                                                                         (local_258,local_278,
                                                                          local_298);
                                                        std::__cxx11::string::~string(local_298);
                                                        std::__cxx11::string::~string(local_278);
                                                        std::__cxx11::string::~string(local_258);
                                                        if (this == (CmsQueryListMetricRequestType *
                                                                    )0x0) {
                                                          aliyun::CmsQueryMetricResponseType::
                                                          ~CmsQueryMetricResponseType
                                                                    ((CmsQueryMetricResponseType *)
                                                                     &req);
                                                          aliyun::CmsQueryMetricRequestType::
                                                          ~CmsQueryMetricRequestType
                                                                    ((CmsQueryMetricRequestType *)
                                                                     &resp);
                                                          resp.code._M_string_length = 0;
                                                          resp.code.field_2._M_allocated_capacity =
                                                               resp.code.field_2.
                                                               _M_allocated_capacity &
                                                               0xffffffffffffff00;
                                                          resp.message._M_string_length = 0;
                                                          resp.message.field_2._M_local_buf[0] =
                                                               '\0';
                                                          resp.success._M_string_length = 0;
                                                          resp.success.field_2._M_local_buf[0] =
                                                               '\0';
                                                          resp.trace_id._M_string_length = 0;
                                                          resp.trace_id.field_2._M_local_buf[0] =
                                                               '\0';
                                                          resp.result._M_dataplus._M_p =
                                                               (pointer)&resp.result.field_2;
                                                          resp.result._M_string_length = 0;
                                                          resp.result.field_2._M_local_buf[0] = '\0'
                                                          ;
                                                          local_d8._M_p = (pointer)&local_c8;
                                                          local_d0 = 0;
                                                          local_c8._M_local_buf[0] = '\0';
                                                          local_b8._M_p = (pointer)&local_a8;
                                                          local_b0 = 0;
                                                          local_a8._M_local_buf[0] = '\0';
                                                          local_98._M_p = (pointer)&local_88;
                                                          local_90 = 0;
                                                          local_88._M_local_buf[0] = '\0';
                                                          local_78._M_p = (pointer)&local_68;
                                                          local_70 = 0;
                                                          req.project_name._M_dataplus._M_p =
                                                               (pointer)0x0;
                                                          req.project_name._M_string_length = 0;
                                                          req.project_name.field_2.
                                                          _M_allocated_capacity = 0;
                                                          req.project_name.field_2._8_8_ =
                                                               &req.metric_stream_name.
                                                                _M_string_length;
                                                          req.metric_stream_name._M_dataplus._M_p =
                                                               (pointer)0x0;
                                                          req.metric_stream_name._M_string_length =
                                                               req.metric_stream_name.
                                                               _M_string_length & 0xffffffffffffff00
                                                          ;
                                                          req.metric_stream_name.field_2._8_8_ =
                                                               &req.sqls._M_string_length;
                                                          req.sqls._M_dataplus._M_p = (pointer)0x0;
                                                          req.sqls._M_string_length =
                                                               req.sqls._M_string_length &
                                                               0xffffffffffffff00;
                                                          req.sqls.field_2._8_8_ = local_1b0;
                                                          local_1b8._M_p = (pointer)0x0;
                                                          local_68._M_local_buf[0] = '\0';
                                                          local_1b0._0_8_ =
                                                               local_1b0._0_8_ & 0xffffffffffffff00;
                                                          local_1b0._16_8_ = &local_190;
                                                          local_198._M_p = (pointer)0x0;
                                                          local_190._M_local_buf[0] = '\0';
                                                          resp.code._M_dataplus._M_p =
                                                               (pointer)paVar1;
                                                          resp.message._M_dataplus._M_p =
                                                               (pointer)paVar2;
                                                          resp.success._M_dataplus._M_p =
                                                               (pointer)paVar3;
                                                          resp.trace_id._M_dataplus._M_p =
                                                               (pointer)paVar4;
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_258,"cn-hangzhou",
                                                                     (allocator<char> *)&local_238);
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_278,"my_appid",
                                                                     (allocator<char> *)&local_2b8);
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_298,"my_secret",
                                                                     &local_2b9);
                                                          this = (CmsQueryListMetricRequestType *)
                                                                 aliyun::Cms::CreateCmsClient
                                                                           (local_258,local_278,
                                                                            local_298);
                                                          std::__cxx11::string::~string(local_298);
                                                          std::__cxx11::string::~string(local_278);
                                                          std::__cxx11::string::~string(local_258);
                                                          if (this == (CmsQueryListMetricRequestType
                                                                       *)0x0) {
                                                            aliyun::CmsQueryMetricTopNResponseType::
                                                            ~CmsQueryMetricTopNResponseType
                                                                      ((
                                                  CmsQueryMetricTopNResponseType *)&req);
                                                  aliyun::CmsQueryMetricTopNRequestType::
                                                  ~CmsQueryMetricTopNRequestType
                                                            ((CmsQueryMetricTopNRequestType *)&resp)
                                                  ;
                                                  resp.code._M_string_length = 0;
                                                  resp.code.field_2._M_allocated_capacity =
                                                       resp.code.field_2._M_allocated_capacity &
                                                       0xffffffffffffff00;
                                                  resp.message._M_string_length = 0;
                                                  resp.message.field_2._M_local_buf[0] = '\0';
                                                  resp.success._M_string_length = 0;
                                                  resp.success.field_2._M_local_buf[0] = '\0';
                                                  resp.trace_id._M_string_length = 0;
                                                  resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                  resp.result._M_dataplus._M_p =
                                                       (pointer)&resp.result.field_2;
                                                  resp.result._M_string_length = 0;
                                                  resp.result.field_2._M_local_buf[0] = '\0';
                                                  local_d8._M_p = (pointer)&local_c8;
                                                  local_d0 = 0;
                                                  local_c8._M_local_buf[0] = '\0';
                                                  local_b8._M_p = (pointer)&local_a8;
                                                  local_b0 = 0;
                                                  local_a8._M_local_buf[0] = '\0';
                                                  local_98._M_p = (pointer)&local_88;
                                                  local_90 = 0;
                                                  local_88._M_local_buf[0] = '\0';
                                                  local_78._M_p = (pointer)&local_68;
                                                  req.project_name._M_dataplus._M_p = (pointer)0x0;
                                                  req.project_name._M_string_length = 0;
                                                  req.project_name.field_2._M_allocated_capacity = 0
                                                  ;
                                                  req.project_name.field_2._8_8_ =
                                                       &req.metric_stream_name._M_string_length;
                                                  req.metric_stream_name._M_dataplus._M_p =
                                                       (pointer)0x0;
                                                  req.metric_stream_name._M_string_length =
                                                       req.metric_stream_name._M_string_length &
                                                       0xffffffffffffff00;
                                                  req.metric_stream_name.field_2._8_8_ =
                                                       &req.sqls._M_string_length;
                                                  local_70 = 0;
                                                  req.sqls._M_dataplus._M_p = (pointer)0x0;
                                                  req.sqls._M_string_length =
                                                       req.sqls._M_string_length &
                                                       0xffffffffffffff00;
                                                  req.sqls.field_2._8_8_ = local_1b0;
                                                  local_1b8._M_p = (pointer)0x0;
                                                  local_68._M_local_buf[0] = '\0';
                                                  local_1b0._0_8_ =
                                                       local_1b0._0_8_ & 0xffffffffffffff00;
                                                  local_1b0._16_8_ = &local_190;
                                                  local_198._M_p = (pointer)0x0;
                                                  local_190._M_local_buf[0] = '\0';
                                                  resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                  resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                  resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                  resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_258,"cn-hangzhou",
                                                             (allocator<char> *)&local_238);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_278,"my_appid",
                                                             (allocator<char> *)&local_2b8);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"my_secret",&local_2b9);
                                                  this = (CmsQueryListMetricRequestType *)
                                                         aliyun::Cms::CreateCmsClient
                                                                   (local_258,local_278,local_298);
                                                  std::__cxx11::string::~string(local_298);
                                                  std::__cxx11::string::~string(local_278);
                                                  std::__cxx11::string::~string(local_258);
                                                  if (this == (CmsQueryListMetricRequestType *)0x0)
                                                  {
                                                    aliyun::CmsQueryStatisticsResponseType::
                                                    ~CmsQueryStatisticsResponseType
                                                              ((CmsQueryStatisticsResponseType *)
                                                               &req);
                                                    aliyun::CmsQueryStatisticsRequestType::
                                                    ~CmsQueryStatisticsRequestType
                                                              ((CmsQueryStatisticsRequestType *)
                                                               &resp);
                                                    req.project_name._M_dataplus._M_p =
                                                         (pointer)&req.project_name.field_2;
                                                    req.project_name._M_string_length = 0;
                                                    req.project_name.field_2._M_allocated_capacity =
                                                         req.project_name.field_2.
                                                         _M_allocated_capacity & 0xffffffffffffff00;
                                                    req.metric_stream_name._M_dataplus._M_p =
                                                         (pointer)&req.metric_stream_name.field_2;
                                                    req.metric_stream_name._M_string_length = 0;
                                                    resp.code._M_string_length = 0;
                                                    resp.code.field_2._M_allocated_capacity =
                                                         resp.code.field_2._M_allocated_capacity &
                                                         0xffffffffffffff00;
                                                    resp.message._M_string_length = 0;
                                                    resp.message.field_2._M_local_buf[0] = '\0';
                                                    resp.success._M_string_length = 0;
                                                    req.metric_stream_name.field_2._M_local_buf[0] =
                                                         '\0';
                                                    resp.success.field_2._M_local_buf[0] = '\0';
                                                    resp.trace_id._M_string_length = 0;
                                                    resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                    resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                    resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                    resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                    resp.trace_id._M_dataplus._M_p = (pointer)paVar4
                                                    ;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_258,"cn-hangzhou",
                                                               (allocator<char> *)&local_238);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_278,"my_appid",
                                                               (allocator<char> *)&local_2b8);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_298,"my_secret",&local_2b9);
                                                    this = (CmsQueryListMetricRequestType *)
                                                           aliyun::Cms::CreateCmsClient
                                                                     (local_258,local_278,local_298)
                                                    ;
                                                    std::__cxx11::string::~string(local_298);
                                                    std::__cxx11::string::~string(local_278);
                                                    std::__cxx11::string::~string(local_258);
                                                    if (this == (CmsQueryListMetricRequestType *)0x0
                                                       ) {
                                                      aliyun::CmsStartMetricStreamResponseType::
                                                      ~CmsStartMetricStreamResponseType
                                                                ((CmsStartMetricStreamResponseType *
                                                                 )&resp);
                                                      aliyun::CmsStartMetricStreamRequestType::
                                                      ~CmsStartMetricStreamRequestType
                                                                ((CmsStartMetricStreamRequestType *)
                                                                 &req);
                                                      req.project_name._M_dataplus._M_p =
                                                           (pointer)&req.project_name.field_2;
                                                      req.project_name._M_string_length = 0;
                                                      resp.code._M_string_length = 0;
                                                      resp.code.field_2._M_allocated_capacity =
                                                           resp.code.field_2._M_allocated_capacity &
                                                           0xffffffffffffff00;
                                                      resp.message._M_string_length = 0;
                                                      resp.message.field_2._M_local_buf[0] = '\0';
                                                      resp.success._M_string_length = 0;
                                                      req.project_name.field_2._M_allocated_capacity
                                                           = req.project_name.field_2.
                                                             _M_allocated_capacity &
                                                             0xffffffffffffff00;
                                                      resp.success.field_2._M_local_buf[0] = '\0';
                                                      resp.trace_id._M_string_length = 0;
                                                      resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                      resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                      resp.message._M_dataplus._M_p =
                                                           (pointer)paVar2;
                                                      resp.success._M_dataplus._M_p =
                                                           (pointer)paVar3;
                                                      resp.trace_id._M_dataplus._M_p =
                                                           (pointer)paVar4;
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_258,"cn-hangzhou",
                                                                 (allocator<char> *)&local_238);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_278,"my_appid",
                                                                 (allocator<char> *)&local_2b8);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_298,"my_secret",&local_2b9);
                                                      this = (CmsQueryListMetricRequestType *)
                                                             aliyun::Cms::CreateCmsClient
                                                                       (local_258,local_278,
                                                                        local_298);
                                                      std::__cxx11::string::~string(local_298);
                                                      std::__cxx11::string::~string(local_278);
                                                      std::__cxx11::string::~string(local_258);
                                                      if (this == (CmsQueryListMetricRequestType *)
                                                                  0x0) {
                                                        aliyun::CmsStartProjectResponseType::
                                                        ~CmsStartProjectResponseType
                                                                  ((CmsStartProjectResponseType *)
                                                                   &resp);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&req);
                                                        req.project_name._M_dataplus._M_p =
                                                             (pointer)&req.project_name.field_2;
                                                        req.project_name._M_string_length = 0;
                                                        resp.code._M_string_length = 0;
                                                        resp.code.field_2._M_allocated_capacity =
                                                             resp.code.field_2._M_allocated_capacity
                                                             & 0xffffffffffffff00;
                                                        resp.message._M_string_length = 0;
                                                        resp.message.field_2._M_local_buf[0] = '\0';
                                                        resp.success._M_string_length = 0;
                                                        resp.success.field_2._M_local_buf[0] = '\0';
                                                        resp.trace_id._M_string_length = 0;
                                                        req.project_name.field_2.
                                                        _M_allocated_capacity =
                                                             req.project_name.field_2.
                                                             _M_allocated_capacity &
                                                             0xffffffffffffff00;
                                                        resp.trace_id.field_2._M_local_buf[0] = '\0'
                                                        ;
                                                        resp.result._M_dataplus._M_p =
                                                             (pointer)&resp.result.field_2;
                                                        resp.result._M_string_length = 0;
                                                        resp.result.field_2._M_local_buf[0] = '\0';
                                                        resp.code._M_dataplus._M_p = (pointer)paVar1
                                                        ;
                                                        resp.message._M_dataplus._M_p =
                                                             (pointer)paVar2;
                                                        resp.success._M_dataplus._M_p =
                                                             (pointer)paVar3;
                                                        resp.trace_id._M_dataplus._M_p =
                                                             (pointer)paVar4;
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_258,"cn-hangzhou",
                                                                   (allocator<char> *)&local_238);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_278,"my_appid",
                                                                   (allocator<char> *)&local_2b8);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_298,"my_secret",&local_2b9)
                                                        ;
                                                        this = (CmsQueryListMetricRequestType *)
                                                               aliyun::Cms::CreateCmsClient
                                                                         (local_258,local_278,
                                                                          local_298);
                                                        std::__cxx11::string::~string(local_298);
                                                        std::__cxx11::string::~string(local_278);
                                                        std::__cxx11::string::~string(local_258);
                                                        if (this == (CmsQueryListMetricRequestType *
                                                                    )0x0) {
                                                          aliyun::CmsStatusProjectResponseType::
                                                          ~CmsStatusProjectResponseType
                                                                    ((CmsStatusProjectResponseType *
                                                                     )&resp);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&req);
                                                          req.project_name._M_dataplus._M_p =
                                                               (pointer)&req.project_name.field_2;
                                                          req.project_name._M_string_length = 0;
                                                          req.project_name.field_2.
                                                          _M_allocated_capacity =
                                                               req.project_name.field_2.
                                                               _M_allocated_capacity &
                                                               0xffffffffffffff00;
                                                          req.metric_stream_name._M_dataplus._M_p =
                                                               (pointer)&req.metric_stream_name.
                                                                         field_2;
                                                          req.metric_stream_name._M_string_length =
                                                               0;
                                                          resp.code._M_string_length = 0;
                                                          resp.code.field_2._M_allocated_capacity =
                                                               resp.code.field_2.
                                                               _M_allocated_capacity &
                                                               0xffffffffffffff00;
                                                          resp.message._M_string_length = 0;
                                                          resp.message.field_2._M_local_buf[0] =
                                                               '\0';
                                                          resp.success._M_string_length = 0;
                                                          req.metric_stream_name.field_2.
                                                          _M_local_buf[0] = '\0';
                                                          resp.success.field_2._M_local_buf[0] =
                                                               '\0';
                                                          resp.trace_id._M_string_length = 0;
                                                          resp.trace_id.field_2._M_local_buf[0] =
                                                               '\0';
                                                          resp.code._M_dataplus._M_p =
                                                               (pointer)paVar1;
                                                          resp.message._M_dataplus._M_p =
                                                               (pointer)paVar2;
                                                          resp.success._M_dataplus._M_p =
                                                               (pointer)paVar3;
                                                          resp.trace_id._M_dataplus._M_p =
                                                               (pointer)paVar4;
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_258,"cn-hangzhou",
                                                                     (allocator<char> *)&local_238);
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_278,"my_appid",
                                                                     (allocator<char> *)&local_2b8);
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_298,"my_secret",
                                                                     &local_2b9);
                                                          this = (CmsQueryListMetricRequestType *)
                                                                 aliyun::Cms::CreateCmsClient
                                                                           (local_258,local_278,
                                                                            local_298);
                                                          std::__cxx11::string::~string(local_298);
                                                          std::__cxx11::string::~string(local_278);
                                                          std::__cxx11::string::~string(local_258);
                                                          if (this == (CmsQueryListMetricRequestType
                                                                       *)0x0) {
                                                            aliyun::CmsStopMetricStreamResponseType
                                                            ::~CmsStopMetricStreamResponseType
                                                                      ((
                                                  CmsStopMetricStreamResponseType *)&resp);
                                                  aliyun::CmsStopMetricStreamRequestType::
                                                  ~CmsStopMetricStreamRequestType
                                                            ((CmsStopMetricStreamRequestType *)&req)
                                                  ;
                                                  req.project_name._M_dataplus._M_p =
                                                       (pointer)&req.project_name.field_2;
                                                  req.project_name._M_string_length = 0;
                                                  resp.code._M_string_length = 0;
                                                  resp.code.field_2._M_allocated_capacity =
                                                       resp.code.field_2._M_allocated_capacity &
                                                       0xffffffffffffff00;
                                                  resp.message._M_string_length = 0;
                                                  resp.message.field_2._M_local_buf[0] = '\0';
                                                  resp.success._M_string_length = 0;
                                                  req.project_name.field_2._M_allocated_capacity =
                                                       req.project_name.field_2.
                                                       _M_allocated_capacity & 0xffffffffffffff00;
                                                  resp.success.field_2._M_local_buf[0] = '\0';
                                                  resp.trace_id._M_string_length = 0;
                                                  resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                  resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                  resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                  resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                  resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_258,"cn-hangzhou",
                                                             (allocator<char> *)&local_238);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_278,"my_appid",
                                                             (allocator<char> *)&local_2b8);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"my_secret",&local_2b9);
                                                  this = (CmsQueryListMetricRequestType *)
                                                         aliyun::Cms::CreateCmsClient
                                                                   (local_258,local_278,local_298);
                                                  std::__cxx11::string::~string(local_298);
                                                  std::__cxx11::string::~string(local_278);
                                                  std::__cxx11::string::~string(local_258);
                                                  if (this == (CmsQueryListMetricRequestType *)0x0)
                                                  {
                                                    aliyun::CmsStopProjectResponseType::
                                                    ~CmsStopProjectResponseType
                                                              ((CmsStopProjectResponseType *)&resp);
                                                    std::__cxx11::string::~string((string *)&req);
                                                    req.project_name._M_dataplus._M_p =
                                                         (pointer)&req.project_name.field_2;
                                                    req.project_name._M_string_length = 0;
                                                    req.project_name.field_2._M_allocated_capacity =
                                                         req.project_name.field_2.
                                                         _M_allocated_capacity & 0xffffffffffffff00;
                                                    req.metric_stream_name._M_dataplus._M_p =
                                                         (pointer)&req.metric_stream_name.field_2;
                                                    req.metric_stream_name._M_string_length = 0;
                                                    resp.code._M_string_length = 0;
                                                    resp.code.field_2._M_allocated_capacity =
                                                         resp.code.field_2._M_allocated_capacity &
                                                         0xffffffffffffff00;
                                                    resp.message._M_string_length = 0;
                                                    resp.message.field_2._M_local_buf[0] = '\0';
                                                    resp.success._M_string_length = 0;
                                                    req.metric_stream_name.field_2._M_local_buf[0] =
                                                         '\0';
                                                    resp.success.field_2._M_local_buf[0] = '\0';
                                                    resp.trace_id._M_string_length = 0;
                                                    resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                    resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                    resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                    resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                    resp.trace_id._M_dataplus._M_p = (pointer)paVar4
                                                    ;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_258,"cn-hangzhou",
                                                               (allocator<char> *)&local_238);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_278,"my_appid",
                                                               (allocator<char> *)&local_2b8);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_298,"my_secret",&local_2b9);
                                                    this = (CmsQueryListMetricRequestType *)
                                                           aliyun::Cms::CreateCmsClient
                                                                     (local_258,local_278,local_298)
                                                    ;
                                                    std::__cxx11::string::~string(local_298);
                                                    std::__cxx11::string::~string(local_278);
                                                    std::__cxx11::string::~string(local_258);
                                                    if (this == (CmsQueryListMetricRequestType *)0x0
                                                       ) {
                                                      aliyun::CmsUpdateDimTableResponseType::
                                                      ~CmsUpdateDimTableResponseType
                                                                ((CmsUpdateDimTableResponseType *)
                                                                 &resp);
                                                      aliyun::CmsUpdateDimTableRequestType::
                                                      ~CmsUpdateDimTableRequestType
                                                                ((CmsUpdateDimTableRequestType *)
                                                                 &req);
                                                      resp.code._M_string_length = 0;
                                                      resp.code.field_2._M_allocated_capacity =
                                                           resp.code.field_2._M_allocated_capacity &
                                                           0xffffffffffffff00;
                                                      resp.message._M_string_length = 0;
                                                      resp.message.field_2._M_local_buf[0] = '\0';
                                                      resp.success._M_string_length = 0;
                                                      resp.success.field_2._M_local_buf[0] = '\0';
                                                      resp.trace_id._M_string_length = 0;
                                                      req.project_name._M_dataplus._M_p =
                                                           (pointer)&req.project_name.field_2;
                                                      req.project_name._M_string_length = 0;
                                                      req.project_name.field_2._M_allocated_capacity
                                                           = req.project_name.field_2.
                                                             _M_allocated_capacity &
                                                             0xffffffffffffff00;
                                                      req.metric_stream_name._M_dataplus._M_p =
                                                           (pointer)&req.metric_stream_name.field_2;
                                                      req.metric_stream_name._M_string_length = 0;
                                                      req.metric_stream_name.field_2._M_local_buf[0]
                                                           = '\0';
                                                      req.sqls._M_dataplus._M_p =
                                                           (pointer)&req.sqls.field_2;
                                                      req.sqls._M_string_length = 0;
                                                      resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                      req.sqls.field_2._M_local_buf[0] = '\0';
                                                      local_1b8._M_p = local_1b0 + 8;
                                                      local_1b0._0_8_ = 0;
                                                      local_1b0[8] = '\0';
                                                      resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                      resp.message._M_dataplus._M_p =
                                                           (pointer)paVar2;
                                                      resp.success._M_dataplus._M_p =
                                                           (pointer)paVar3;
                                                      resp.trace_id._M_dataplus._M_p =
                                                           (pointer)paVar4;
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_258,"cn-hangzhou",
                                                                 (allocator<char> *)&local_238);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_278,"my_appid",
                                                                 (allocator<char> *)&local_2b8);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_298,"my_secret",&local_2b9);
                                                      this = (CmsQueryListMetricRequestType *)
                                                             aliyun::Cms::CreateCmsClient
                                                                       (local_258,local_278,
                                                                        local_298);
                                                      std::__cxx11::string::~string(local_298);
                                                      std::__cxx11::string::~string(local_278);
                                                      std::__cxx11::string::~string(local_258);
                                                      if (this == (CmsQueryListMetricRequestType *)
                                                                  0x0) {
                                                        aliyun::CmsUpdateMetricsResponseType::
                                                        ~CmsUpdateMetricsResponseType
                                                                  ((CmsUpdateMetricsResponseType *)
                                                                   &req);
                                                        aliyun::CmsUpdateMetricsRequestType::
                                                        ~CmsUpdateMetricsRequestType
                                                                  ((CmsUpdateMetricsRequestType *)
                                                                   &resp);
                                                        req.project_name._M_dataplus._M_p =
                                                             (pointer)&req.project_name.field_2;
                                                        req.project_name._M_string_length = 0;
                                                        req.project_name.field_2.
                                                        _M_allocated_capacity =
                                                             req.project_name.field_2.
                                                             _M_allocated_capacity &
                                                             0xffffffffffffff00;
                                                        req.metric_stream_name._M_dataplus._M_p =
                                                             (pointer)&req.metric_stream_name.
                                                                       field_2;
                                                        req.metric_stream_name._M_string_length = 0;
                                                        req.metric_stream_name.field_2._M_local_buf
                                                        [0] = '\0';
                                                        req.sqls._M_dataplus._M_p =
                                                             (pointer)&req.sqls.field_2;
                                                        req.sqls._M_string_length = 0;
                                                        resp.code._M_string_length = 0;
                                                        resp.code.field_2._M_allocated_capacity =
                                                             resp.code.field_2._M_allocated_capacity
                                                             & 0xffffffffffffff00;
                                                        resp.message._M_string_length = 0;
                                                        resp.message.field_2._M_local_buf[0] = '\0';
                                                        resp.success._M_string_length = 0;
                                                        req.sqls.field_2._M_local_buf[0] = '\0';
                                                        resp.success.field_2._M_local_buf[0] = '\0';
                                                        resp.trace_id._M_string_length = 0;
                                                        resp.trace_id.field_2._M_local_buf[0] = '\0'
                                                        ;
                                                        resp.code._M_dataplus._M_p = (pointer)paVar1
                                                        ;
                                                        resp.message._M_dataplus._M_p =
                                                             (pointer)paVar2;
                                                        resp.success._M_dataplus._M_p =
                                                             (pointer)paVar3;
                                                        resp.trace_id._M_dataplus._M_p =
                                                             (pointer)paVar4;
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_258,"cn-hangzhou",
                                                                   (allocator<char> *)&local_238);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_278,"my_appid",
                                                                   (allocator<char> *)&local_2b8);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_298,"my_secret",&local_2b9)
                                                        ;
                                                        this = (CmsQueryListMetricRequestType *)
                                                               aliyun::Cms::CreateCmsClient
                                                                         (local_258,local_278,
                                                                          local_298);
                                                        std::__cxx11::string::~string(local_298);
                                                        std::__cxx11::string::~string(local_278);
                                                        std::__cxx11::string::~string(local_258);
                                                        if (this == (CmsQueryListMetricRequestType *
                                                                    )0x0) {
                                                          aliyun::CmsUpdateMetricStreamResponseType
                                                          ::~CmsUpdateMetricStreamResponseType
                                                                    ((
                                                  CmsUpdateMetricStreamResponseType *)&resp);
                                                  aliyun::CmsUpdateMetricStreamRequestType::
                                                  ~CmsUpdateMetricStreamRequestType
                                                            ((CmsUpdateMetricStreamRequestType *)
                                                             &req);
                                                  req.project_name._M_dataplus._M_p =
                                                       (pointer)&req.project_name.field_2;
                                                  req.project_name._M_string_length = 0;
                                                  req.project_name.field_2._M_allocated_capacity =
                                                       req.project_name.field_2.
                                                       _M_allocated_capacity & 0xffffffffffffff00;
                                                  req.metric_stream_name._M_dataplus._M_p =
                                                       (pointer)&req.metric_stream_name.field_2;
                                                  req.metric_stream_name._M_string_length = 0;
                                                  resp.code._M_string_length = 0;
                                                  resp.code.field_2._M_allocated_capacity =
                                                       resp.code.field_2._M_allocated_capacity &
                                                       0xffffffffffffff00;
                                                  resp.message._M_string_length = 0;
                                                  resp.message.field_2._M_local_buf[0] = '\0';
                                                  resp.success._M_string_length = 0;
                                                  req.metric_stream_name.field_2._M_local_buf[0] =
                                                       '\0';
                                                  resp.success.field_2._M_local_buf[0] = '\0';
                                                  resp.trace_id._M_string_length = 0;
                                                  resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                  resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                  resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                  resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                  resp.trace_id._M_dataplus._M_p = (pointer)paVar4;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_258,"cn-hangzhou",
                                                             (allocator<char> *)&local_238);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_278,"my_appid",
                                                             (allocator<char> *)&local_2b8);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"my_secret",&local_2b9);
                                                  this = (CmsQueryListMetricRequestType *)
                                                         aliyun::Cms::CreateCmsClient
                                                                   (local_258,local_278,local_298);
                                                  std::__cxx11::string::~string(local_298);
                                                  std::__cxx11::string::~string(local_278);
                                                  std::__cxx11::string::~string(local_258);
                                                  if (this == (CmsQueryListMetricRequestType *)0x0)
                                                  {
                                                    aliyun::CmsUpdateProjectResponseType::
                                                    ~CmsUpdateProjectResponseType
                                                              ((CmsUpdateProjectResponseType *)&resp
                                                              );
                                                    aliyun::CmsUpdateProjectRequestType::
                                                    ~CmsUpdateProjectRequestType
                                                              ((CmsUpdateProjectRequestType *)&req);
                                                    resp.code._M_string_length = 0;
                                                    resp.code.field_2._M_allocated_capacity =
                                                         resp.code.field_2._M_allocated_capacity &
                                                         0xffffffffffffff00;
                                                    resp.message._M_string_length = 0;
                                                    resp.message.field_2._M_local_buf[0] = '\0';
                                                    resp.success._M_string_length = 0;
                                                    resp.success.field_2._M_local_buf[0] = '\0';
                                                    resp.trace_id._M_string_length = 0;
                                                    req.project_name._M_dataplus._M_p =
                                                         (pointer)&req.project_name.field_2;
                                                    req.project_name._M_string_length = 0;
                                                    req.project_name.field_2._M_allocated_capacity =
                                                         req.project_name.field_2.
                                                         _M_allocated_capacity & 0xffffffffffffff00;
                                                    req.metric_stream_name._M_dataplus._M_p =
                                                         (pointer)&req.metric_stream_name.field_2;
                                                    req.metric_stream_name._M_string_length = 0;
                                                    req.metric_stream_name.field_2._M_local_buf[0] =
                                                         '\0';
                                                    req.sqls._M_dataplus._M_p =
                                                         (pointer)&req.sqls.field_2;
                                                    req.sqls._M_string_length = 0;
                                                    resp.trace_id.field_2._M_local_buf[0] = '\0';
                                                    req.sqls.field_2._M_local_buf[0] = '\0';
                                                    local_1b8._M_p = local_1b0 + 8;
                                                    local_1b0._0_8_ = 0;
                                                    local_1b0[8] = '\0';
                                                    resp.code._M_dataplus._M_p = (pointer)paVar1;
                                                    resp.message._M_dataplus._M_p = (pointer)paVar2;
                                                    resp.success._M_dataplus._M_p = (pointer)paVar3;
                                                    resp.trace_id._M_dataplus._M_p = (pointer)paVar4
                                                    ;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_258,"cn-hangzhou",
                                                               (allocator<char> *)&local_238);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_278,"my_appid",
                                                               (allocator<char> *)&local_2b8);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_298,"my_secret",&local_2b9);
                                                    this = (CmsQueryListMetricRequestType *)
                                                           aliyun::Cms::CreateCmsClient
                                                                     (local_258,local_278,local_298)
                                                    ;
                                                    std::__cxx11::string::~string(local_298);
                                                    std::__cxx11::string::~string(local_278);
                                                    std::__cxx11::string::~string(local_258);
                                                    if (this == (CmsQueryListMetricRequestType *)0x0
                                                       ) {
                                                      aliyun::CmsupdateSQLMetricsResponseType::
                                                      ~CmsupdateSQLMetricsResponseType
                                                                ((CmsupdateSQLMetricsResponseType *)
                                                                 &req);
                                                      aliyun::CmsupdateSQLMetricsRequestType::
                                                      ~CmsupdateSQLMetricsRequestType
                                                                ((CmsupdateSQLMetricsRequestType *)
                                                                 &resp);
                                                      return 0;
                                                    }
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&resp);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.message);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.success);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.trace_id);
                                                  aliyun::Cms::updateSQLMetrics
                                                            ((CmsupdateSQLMetricsRequestType *)this,
                                                             (CmsupdateSQLMetricsResponseType *)
                                                             &resp,(CmsErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  aliyun::Cms::UpdateProject
                                                            ((CmsUpdateProjectRequestType *)this,
                                                             (CmsUpdateProjectResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  std::__cxx11::string::assign((char *)&req.sqls);
                                                  aliyun::Cms::UpdateMetricStream
                                                            ((CmsUpdateMetricStreamRequestType *)
                                                             this,(CmsUpdateMetricStreamResponseType
                                                                   *)&req,(CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&resp);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.message);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.success);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.trace_id);
                                                  aliyun::Cms::UpdateMetrics
                                                            ((CmsUpdateMetricsRequestType *)this,
                                                             (CmsUpdateMetricsResponseType *)&resp,
                                                             (CmsErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  aliyun::Cms::UpdateDimTable
                                                            ((CmsUpdateDimTableRequestType *)this,
                                                             (CmsUpdateDimTableResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  aliyun::Cms::StopProject
                                                            ((CmsStopProjectRequestType *)this,
                                                             (CmsStopProjectResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  aliyun::Cms::StopMetricStream
                                                            ((CmsStopMetricStreamRequestType *)this,
                                                             (CmsStopMetricStreamResponseType *)&req
                                                             ,(CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  aliyun::Cms::StatusProject
                                                            ((CmsStatusProjectRequestType *)this,
                                                             (CmsStatusProjectResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  aliyun::Cms::StartProject
                                                            ((CmsStartProjectRequestType *)this,
                                                             (CmsStartProjectResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  aliyun::Cms::StartMetricStream
                                                            ((CmsStartMetricStreamRequestType *)this
                                                             ,(CmsStartMetricStreamResponseType *)
                                                              &req,(CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&resp);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.message);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.success);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.trace_id);
                                                  std::__cxx11::string::assign((char *)&resp.result)
                                                  ;
                                                  std::__cxx11::string::assign((char *)&local_d8);
                                                  std::__cxx11::string::assign((char *)&local_b8);
                                                  std::__cxx11::string::assign((char *)&local_98);
                                                  std::__cxx11::string::assign((char *)&local_78);
                                                  aliyun::Cms::QueryStatistics
                                                            ((CmsQueryStatisticsRequestType *)this,
                                                             (CmsQueryStatisticsResponseType *)&resp
                                                             ,(CmsErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&resp);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.message);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.success);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.trace_id);
                                                  std::__cxx11::string::assign((char *)&resp.result)
                                                  ;
                                                  std::__cxx11::string::assign((char *)&local_d8);
                                                  std::__cxx11::string::assign((char *)&local_b8);
                                                  std::__cxx11::string::assign((char *)&local_98);
                                                  std::__cxx11::string::assign((char *)&local_78);
                                                  aliyun::Cms::QueryMetricTopN
                                                            ((CmsQueryMetricTopNRequestType *)this,
                                                             (CmsQueryMetricTopNResponseType *)&resp
                                                             ,(CmsErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&resp);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.message);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.success);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.trace_id);
                                                  std::__cxx11::string::assign((char *)&resp.result)
                                                  ;
                                                  std::__cxx11::string::assign((char *)&local_d8);
                                                  std::__cxx11::string::assign((char *)&local_b8);
                                                  std::__cxx11::string::assign((char *)&local_98);
                                                  std::__cxx11::string::assign((char *)&local_78);
                                                  aliyun::Cms::QueryMetric
                                                            ((CmsQueryMetricRequestType *)this,
                                                             (CmsQueryMetricResponseType *)&resp,
                                                             (CmsErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&resp);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.message);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.success);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.trace_id);
                                                  std::__cxx11::string::assign((char *)&resp.result)
                                                  ;
                                                  std::__cxx11::string::assign((char *)&local_d8);
                                                  std::__cxx11::string::assign((char *)&local_b8);
                                                  std::__cxx11::string::assign((char *)&local_98);
                                                  std::__cxx11::string::assign((char *)&local_78);
                                                  std::__cxx11::string::assign((char *)&local_58);
                                                  aliyun::Cms::QueryListMetric
                                                            (this,(CmsQueryListMetricResponseType *)
                                                                  &resp,(CmsErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&resp);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.message);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.success);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.trace_id);
                                                  std::__cxx11::string::assign((char *)&resp.result)
                                                  ;
                                                  std::__cxx11::string::assign((char *)&local_d8);
                                                  std::__cxx11::string::assign((char *)&local_b8);
                                                  std::__cxx11::string::assign((char *)&local_98);
                                                  std::__cxx11::string::assign((char *)&local_78);
                                                  aliyun::Cms::QueryIncremental
                                                            ((CmsQueryIncrementalRequestType *)this,
                                                             (CmsQueryIncrementalResponseType *)
                                                             &resp,(CmsErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  aliyun::Cms::PutDimTableData
                                                            ((CmsPutDimTableDataRequestType *)this,
                                                             (CmsPutDimTableDataResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  std::__cxx11::string::assign((char *)&req.sqls);
                                                  std::__cxx11::string::assign((char *)&local_1b8);
                                                  aliyun::Cms::ListSQLMetrics
                                                            ((CmsListSQLMetricsRequestType *)this,
                                                             (CmsListSQLMetricsResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  std::__cxx11::string::assign((char *)&req.sqls);
                                                  aliyun::Cms::ListProject
                                                            ((CmsListProjectRequestType *)this,
                                                             (CmsListProjectResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  std::__cxx11::string::assign((char *)&req.sqls);
                                                  std::__cxx11::string::assign((char *)&local_1b8);
                                                  aliyun::Cms::ListMetricStream
                                                            ((CmsListMetricStreamRequestType *)this,
                                                             (CmsListMetricStreamResponseType *)&req
                                                             ,(CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&resp);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.message);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.success);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.trace_id);
                                                  std::__cxx11::string::assign((char *)&resp.result)
                                                  ;
                                                  aliyun::Cms::ListMetricsPlan
                                                            ((CmsListMetricsPlanRequestType *)this,
                                                             (CmsListMetricsPlanResponseType *)&resp
                                                             ,(CmsErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&resp);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.message);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.success);
                                                  std::__cxx11::string::assign
                                                            ((char *)&resp.trace_id);
                                                  std::__cxx11::string::assign((char *)&resp.result)
                                                  ;
                                                  aliyun::Cms::ListMetrics
                                                            ((CmsListMetricsRequestType *)this,
                                                             (CmsListMetricsResponseType *)&resp,
                                                             (CmsErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  aliyun::Cms::ListDimTableData
                                                            ((CmsListDimTableDataRequestType *)this,
                                                             (CmsListDimTableDataResponseType *)&req
                                                             ,(CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  std::__cxx11::string::assign((char *)&req.sqls);
                                                  aliyun::Cms::ListDimTable
                                                            ((CmsListDimTableRequestType *)this,
                                                             (CmsListDimTableResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  aliyun::Cms::GetSQLMetrics
                                                            ((CmsGetSQLMetricsRequestType *)this,
                                                             (CmsGetSQLMetricsResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_238,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_2b8);
                                                    aliyun::Cms::SetProxyHost
                                                              ((Cms *)this,&local_238);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_238);
                                                    if ((char)(this->metric)._M_string_length ==
                                                        '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->metric)._M_string_length + 1)
                                                           = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_2b8,
                                                                                                                              
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  aliyun::Cms::GetProject
                                                            ((CmsGetProjectRequestType *)this,
                                                             (CmsGetProjectResponseType *)&req,
                                                             (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                }
                                                else {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_238,"127.0.0.1:12234",
                                                             (allocator<char> *)&local_2b8);
                                                  aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_238);
                                                  if ((char)(this->metric)._M_string_length ==
                                                      '\x01') {
                                                    *(undefined1 *)
                                                     ((long)&(this->metric)._M_string_length + 1) =
                                                         0;
                                                  }
                                                  this_00 = (HttpTestListener *)operator_new(0x180);
                                                  HttpTestListener::HttpTestListener(this_00,0x2fca)
                                                  ;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_2b8,
                                                                                                                          
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_2b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2b8);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign
                                                            ((char *)&req.metric_stream_name);
                                                  aliyun::Cms::GetMetricStreamStatus
                                                            ((CmsGetMetricStreamStatusRequestType *)
                                                             this,(
                                                  CmsGetMetricStreamStatusResponseType *)&req,
                                                  (CmsErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                }
                                              }
                                              else {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_238,"127.0.0.1:12234",
                                                           (allocator<char> *)&local_2b8);
                                                aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                                std::__cxx11::string::~string((string *)&local_238);
                                                if ((char)(this->metric)._M_string_length == '\x01')
                                                {
                                                  *(undefined1 *)
                                                   ((long)&(this->metric)._M_string_length + 1) = 0;
                                                }
                                                this_00 = (HttpTestListener *)operator_new(0x180);
                                                HttpTestListener::HttpTestListener(this_00,0x2fca);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_2b8,
                                                                                                                      
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                                  ,&local_2b9);
                                                HttpTestListener::SetResponseBody
                                                          (this_00,&local_2b8);
                                                std::__cxx11::string::~string((string *)&local_2b8);
                                                HttpTestListener::Start(this_00);
                                                std::__cxx11::string::assign((char *)&req);
                                                std::__cxx11::string::assign
                                                          ((char *)&req.metric_stream_name);
                                                aliyun::Cms::GetMetricStreamMeta
                                                          ((CmsGetMetricStreamMetaRequestType *)this
                                                           ,(CmsGetMetricStreamMetaResponseType *)
                                                            &req,(CmsErrorInfo *)&resp);
                                                HttpTestListener::WaitComplete(this_00);
                                              }
                                            }
                                            else {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_238,"127.0.0.1:12234",
                                                         (allocator<char> *)&local_2b8);
                                              aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                              std::__cxx11::string::~string((string *)&local_238);
                                              if ((char)(this->metric)._M_string_length == '\x01') {
                                                *(undefined1 *)
                                                 ((long)&(this->metric)._M_string_length + 1) = 0;
                                              }
                                              this_00 = (HttpTestListener *)operator_new(0x180);
                                              HttpTestListener::HttpTestListener(this_00,0x2fca);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_2b8,
                                                                                                                  
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                                                  ,&local_2b9);
                                              HttpTestListener::SetResponseBody(this_00,&local_2b8);
                                              std::__cxx11::string::~string((string *)&local_2b8);
                                              HttpTestListener::Start(this_00);
                                              std::__cxx11::string::assign((char *)&req);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.metric_stream_name);
                                              aliyun::Cms::GetMetricStream
                                                        ((CmsGetMetricStreamRequestType *)this,
                                                         (CmsGetMetricStreamResponseType *)&req,
                                                         (CmsErrorInfo *)&resp);
                                              HttpTestListener::WaitComplete(this_00);
                                            }
                                          }
                                          else {
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_238,"127.0.0.1:12234",
                                                       (allocator<char> *)&local_2b8);
                                            aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                            std::__cxx11::string::~string((string *)&local_238);
                                            if ((char)(this->metric)._M_string_length == '\x01') {
                                              *(undefined1 *)
                                               ((long)&(this->metric)._M_string_length + 1) = 0;
                                            }
                                            this_00 = (HttpTestListener *)operator_new(0x180);
                                            HttpTestListener::HttpTestListener(this_00,0x2fca);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_2b8,
                                                                                                              
                                                  "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"NextToken\": \"NextToken\",  \"Code\": \"Code\",  \"Message\": \"Message\"}"
                                                  ,&local_2b9);
                                            HttpTestListener::SetResponseBody(this_00,&local_2b8);
                                            std::__cxx11::string::~string((string *)&local_2b8);
                                            HttpTestListener::Start(this_00);
                                            std::__cxx11::string::assign((char *)&resp);
                                            std::__cxx11::string::assign((char *)&resp.message);
                                            std::__cxx11::string::assign((char *)&resp.success);
                                            std::__cxx11::string::assign((char *)&resp.trace_id);
                                            std::__cxx11::string::assign((char *)&resp.result);
                                            std::__cxx11::string::assign((char *)&local_d8);
                                            std::__cxx11::string::assign((char *)&local_b8);
                                            std::__cxx11::string::assign((char *)&local_98);
                                            aliyun::Cms::GetMetricStatistics
                                                      ((CmsGetMetricStatisticsRequestType *)this,
                                                       (CmsGetMetricStatisticsResponseType *)&resp,
                                                       (CmsErrorInfo *)&req);
                                            HttpTestListener::WaitComplete(this_00);
                                          }
                                        }
                                        else {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_238,"127.0.0.1:12234",
                                                     (allocator<char> *)&local_2b8);
                                          aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                          std::__cxx11::string::~string((string *)&local_238);
                                          if ((char)(this->metric)._M_string_length == '\x01') {
                                            *(undefined1 *)
                                             ((long)&(this->metric)._M_string_length + 1) = 0;
                                          }
                                          this_00 = (HttpTestListener *)operator_new(0x180);
                                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_2b8,
                                                                                                          
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                                                  ,&local_2b9);
                                          HttpTestListener::SetResponseBody(this_00,&local_2b8);
                                          std::__cxx11::string::~string((string *)&local_2b8);
                                          HttpTestListener::Start(this_00);
                                          std::__cxx11::string::assign((char *)&req);
                                          std::__cxx11::string::assign
                                                    ((char *)&req.metric_stream_name);
                                          aliyun::Cms::GetMetricsMeta
                                                    ((CmsGetMetricsMetaRequestType *)this,
                                                     (CmsGetMetricsMetaResponseType *)&req,
                                                     (CmsErrorInfo *)&resp);
                                          HttpTestListener::WaitComplete(this_00);
                                        }
                                      }
                                      else {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_238,"127.0.0.1:12234",
                                                   (allocator<char> *)&local_2b8);
                                        aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                        std::__cxx11::string::~string((string *)&local_238);
                                        if ((char)(this->metric)._M_string_length == '\x01') {
                                          *(undefined1 *)
                                           ((long)&(this->metric)._M_string_length + 1) = 0;
                                        }
                                        this_00 = (HttpTestListener *)operator_new(0x180);
                                        HttpTestListener::HttpTestListener(this_00,0x2fca);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_2b8,
                                                                                                      
                                                  "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                                                  ,&local_2b9);
                                        HttpTestListener::SetResponseBody(this_00,&local_2b8);
                                        std::__cxx11::string::~string((string *)&local_2b8);
                                        HttpTestListener::Start(this_00);
                                        std::__cxx11::string::assign((char *)&req);
                                        std::__cxx11::string::assign
                                                  ((char *)&req.metric_stream_name);
                                        std::__cxx11::string::assign((char *)&req.sqls);
                                        aliyun::Cms::GetMetrics
                                                  ((CmsGetMetricsRequestType *)this,
                                                   (CmsGetMetricsResponseType *)&req,
                                                   (CmsErrorInfo *)&resp);
                                        HttpTestListener::WaitComplete(this_00);
                                      }
                                    }
                                    else {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_238,"127.0.0.1:12234",
                                                 (allocator<char> *)&local_2b8);
                                      aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                      std::__cxx11::string::~string((string *)&local_238);
                                      if ((char)(this->metric)._M_string_length == '\x01') {
                                        *(undefined1 *)((long)&(this->metric)._M_string_length + 1)
                                             = 0;
                                      }
                                      this_00 = (HttpTestListener *)operator_new(0x180);
                                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_2b8,
                                                 "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                                                 ,&local_2b9);
                                      HttpTestListener::SetResponseBody(this_00,&local_2b8);
                                      std::__cxx11::string::~string((string *)&local_2b8);
                                      HttpTestListener::Start(this_00);
                                      std::__cxx11::string::assign((char *)&req);
                                      aliyun::Cms::GetDimTable
                                                ((CmsGetDimTableRequestType *)this,
                                                 (CmsGetDimTableResponseType *)&req,
                                                 (CmsErrorInfo *)&resp);
                                      HttpTestListener::WaitComplete(this_00);
                                    }
                                  }
                                  else {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_238,"127.0.0.1:12234",
                                               (allocator<char> *)&local_2b8);
                                    aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                    std::__cxx11::string::~string((string *)&local_238);
                                    if ((char)(this->metric)._M_string_length == '\x01') {
                                      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) =
                                           0;
                                    }
                                    this_00 = (HttpTestListener *)operator_new(0x180);
                                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_2b8,
                                               "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                               ,&local_2b9);
                                    HttpTestListener::SetResponseBody(this_00,&local_2b8);
                                    std::__cxx11::string::~string((string *)&local_2b8);
                                    HttpTestListener::Start(this_00);
                                    std::__cxx11::string::assign((char *)&resp);
                                    std::__cxx11::string::assign((char *)&resp.message);
                                    std::__cxx11::string::assign((char *)&resp.success);
                                    std::__cxx11::string::assign((char *)&resp.trace_id);
                                    std::__cxx11::string::assign((char *)&resp.result);
                                    std::__cxx11::string::assign((char *)&local_d8);
                                    std::__cxx11::string::assign((char *)&local_b8);
                                    std::__cxx11::string::assign((char *)&local_98);
                                    aliyun::Cms::DescribeMetricList
                                              ((CmsDescribeMetricListRequestType *)this,
                                               (CmsDescribeMetricListResponseType *)&resp,
                                               (CmsErrorInfo *)&req);
                                    HttpTestListener::WaitComplete(this_00);
                                  }
                                }
                                else {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_238,"127.0.0.1:12234",
                                             (allocator<char> *)&local_2b8);
                                  aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                  std::__cxx11::string::~string((string *)&local_238);
                                  if ((char)(this->metric)._M_string_length == '\x01') {
                                    *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                                  }
                                  this_00 = (HttpTestListener *)operator_new(0x180);
                                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_2b8,
                                             "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                             ,&local_2b9);
                                  HttpTestListener::SetResponseBody(this_00,&local_2b8);
                                  std::__cxx11::string::~string((string *)&local_2b8);
                                  HttpTestListener::Start(this_00);
                                  std::__cxx11::string::assign((char *)&resp);
                                  std::__cxx11::string::assign((char *)&resp.message);
                                  std::__cxx11::string::assign((char *)&resp.success);
                                  std::__cxx11::string::assign((char *)&resp.trace_id);
                                  std::__cxx11::string::assign((char *)&resp.result);
                                  std::__cxx11::string::assign((char *)&local_d8);
                                  std::__cxx11::string::assign((char *)&local_b8);
                                  std::__cxx11::string::assign((char *)&local_98);
                                  std::__cxx11::string::assign((char *)&local_78);
                                  aliyun::Cms::DescribeMetricDatum
                                            ((CmsDescribeMetricDatumRequestType *)this,
                                             (CmsDescribeMetricDatumResponseType *)&resp,
                                             (CmsErrorInfo *)&req);
                                  HttpTestListener::WaitComplete(this_00);
                                }
                              }
                              else {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_238,"127.0.0.1:12234",
                                           (allocator<char> *)&local_2b8);
                                aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                                std::__cxx11::string::~string((string *)&local_238);
                                if ((char)(this->metric)._M_string_length == '\x01') {
                                  *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                                }
                                this_00 = (HttpTestListener *)operator_new(0x180);
                                HttpTestListener::HttpTestListener(this_00,0x2fca);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_2b8,
                                           "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                           ,&local_2b9);
                                HttpTestListener::SetResponseBody(this_00,&local_2b8);
                                std::__cxx11::string::~string((string *)&local_2b8);
                                HttpTestListener::Start(this_00);
                                std::__cxx11::string::assign((char *)&resp);
                                std::__cxx11::string::assign((char *)&resp.message);
                                std::__cxx11::string::assign((char *)&resp.success);
                                std::__cxx11::string::assign((char *)&resp.trace_id);
                                std::__cxx11::string::assign((char *)&resp.result);
                                std::__cxx11::string::assign((char *)&local_d8);
                                aliyun::Cms::DescribeMetric
                                          ((CmsDescribeMetricRequestType *)this,
                                           (CmsDescribeMetricResponseType *)&resp,
                                           (CmsErrorInfo *)&req);
                                HttpTestListener::WaitComplete(this_00);
                              }
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_238,"127.0.0.1:12234",
                                         (allocator<char> *)&local_2b8);
                              aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                              std::__cxx11::string::~string((string *)&local_238);
                              if ((char)(this->metric)._M_string_length == '\x01') {
                                *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                              }
                              this_00 = (HttpTestListener *)operator_new(0x180);
                              HttpTestListener::HttpTestListener(this_00,0x2fca);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_2b8,
                                         "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                         ,&local_2b9);
                              HttpTestListener::SetResponseBody(this_00,&local_2b8);
                              std::__cxx11::string::~string((string *)&local_2b8);
                              HttpTestListener::Start(this_00);
                              std::__cxx11::string::assign((char *)&req);
                              aliyun::Cms::DeleteProject
                                        ((CmsDeleteProjectRequestType *)this,
                                         (CmsDeleteProjectResponseType *)&req,(CmsErrorInfo *)&resp)
                              ;
                              HttpTestListener::WaitComplete(this_00);
                            }
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_238,"127.0.0.1:12234",
                                       (allocator<char> *)&local_2b8);
                            aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                            std::__cxx11::string::~string((string *)&local_238);
                            if ((char)(this->metric)._M_string_length == '\x01') {
                              *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                            }
                            this_00 = (HttpTestListener *)operator_new(0x180);
                            HttpTestListener::HttpTestListener(this_00,0x2fca);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_2b8,
                                       "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                       ,&local_2b9);
                            HttpTestListener::SetResponseBody(this_00,&local_2b8);
                            std::__cxx11::string::~string((string *)&local_2b8);
                            HttpTestListener::Start(this_00);
                            std::__cxx11::string::assign((char *)&req);
                            std::__cxx11::string::assign((char *)&req.metric_stream_name);
                            aliyun::Cms::DeleteMetricStream
                                      ((CmsDeleteMetricStreamRequestType *)this,
                                       (CmsDeleteMetricStreamResponseType *)&req,
                                       (CmsErrorInfo *)&resp);
                            HttpTestListener::WaitComplete(this_00);
                          }
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_238,"127.0.0.1:12234",
                                     (allocator<char> *)&local_2b8);
                          aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                          std::__cxx11::string::~string((string *)&local_238);
                          if ((char)(this->metric)._M_string_length == '\x01') {
                            *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                          }
                          this_00 = (HttpTestListener *)operator_new(0x180);
                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_2b8,
                                     "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                     ,&local_2b9);
                          HttpTestListener::SetResponseBody(this_00,&local_2b8);
                          std::__cxx11::string::~string((string *)&local_2b8);
                          HttpTestListener::Start(this_00);
                          std::__cxx11::string::assign((char *)&req);
                          std::__cxx11::string::assign((char *)&req.metric_stream_name);
                          aliyun::Cms::DeleteMetrics
                                    ((CmsDeleteMetricsRequestType *)this,
                                     (CmsDeleteMetricsResponseType *)&req,(CmsErrorInfo *)&resp);
                          HttpTestListener::WaitComplete(this_00);
                        }
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_238,"127.0.0.1:12234",
                                   (allocator<char> *)&local_2b8);
                        aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                        std::__cxx11::string::~string((string *)&local_238);
                        if ((char)(this->metric)._M_string_length == '\x01') {
                          *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                        }
                        this_00 = (HttpTestListener *)operator_new(0x180);
                        HttpTestListener::HttpTestListener(this_00,0x2fca);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_2b8,
                                   "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                   ,&local_2b9);
                        HttpTestListener::SetResponseBody(this_00,&local_2b8);
                        std::__cxx11::string::~string((string *)&local_2b8);
                        HttpTestListener::Start(this_00);
                        std::__cxx11::string::assign((char *)&req);
                        std::__cxx11::string::assign((char *)&req.metric_stream_name);
                        aliyun::Cms::DeleteDimTableData
                                  ((CmsDeleteDimTableDataRequestType *)this,
                                   (CmsDeleteDimTableDataResponseType *)&req,(CmsErrorInfo *)&resp);
                        HttpTestListener::WaitComplete(this_00);
                      }
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_238,"127.0.0.1:12234",
                                 (allocator<char> *)&local_2b8);
                      aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                      std::__cxx11::string::~string((string *)&local_238);
                      if ((char)(this->metric)._M_string_length == '\x01') {
                        *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                      }
                      this_00 = (HttpTestListener *)operator_new(0x180);
                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2b8,
                                 "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                                 ,&local_2b9);
                      HttpTestListener::SetResponseBody(this_00,&local_2b8);
                      std::__cxx11::string::~string((string *)&local_2b8);
                      HttpTestListener::Start(this_00);
                      std::__cxx11::string::assign((char *)&req);
                      aliyun::Cms::DeleteDimTable
                                ((CmsDeleteDimTableRequestType *)this,
                                 (CmsDeleteDimTableResponseType *)&req,(CmsErrorInfo *)&resp);
                      HttpTestListener::WaitComplete(this_00);
                    }
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_238,"127.0.0.1:12234",(allocator<char> *)&local_2b8)
                    ;
                    aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                    std::__cxx11::string::~string((string *)&local_238);
                    if ((char)(this->metric)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                    }
                    this_00 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2b8,
                               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                               ,&local_2b9);
                    HttpTestListener::SetResponseBody(this_00,&local_2b8);
                    std::__cxx11::string::~string((string *)&local_2b8);
                    HttpTestListener::Start(this_00);
                    std::__cxx11::string::assign((char *)&req);
                    std::__cxx11::string::assign((char *)&req.metric_stream_name);
                    std::__cxx11::string::assign((char *)&req.sqls);
                    aliyun::Cms::CreateSQLMetrics
                              ((CmsCreateSQLMetricsRequestType *)this,
                               (CmsCreateSQLMetricsResponseType *)&req,(CmsErrorInfo *)&resp);
                    HttpTestListener::WaitComplete(this_00);
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_238,"127.0.0.1:12234",(allocator<char> *)&local_2b8);
                  aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                  std::__cxx11::string::~string((string *)&local_238);
                  if ((char)(this->metric)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2b8,
                             "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                             ,&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,&local_2b8);
                  std::__cxx11::string::~string((string *)&local_2b8);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  aliyun::Cms::CreateProject
                            ((CmsCreateProjectRequestType *)this,
                             (CmsCreateProjectResponseType *)&req,(CmsErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_238,"127.0.0.1:12234",(allocator<char> *)&local_2b8);
                aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
                std::__cxx11::string::~string((string *)&local_238);
                if ((char)(this->metric)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
                }
                this_00 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(this_00,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2b8,
                           "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                           ,&local_2b9);
                HttpTestListener::SetResponseBody(this_00,&local_2b8);
                std::__cxx11::string::~string((string *)&local_2b8);
                HttpTestListener::Start(this_00);
                std::__cxx11::string::assign((char *)&req);
                std::__cxx11::string::assign((char *)&req.metric_stream_name);
                aliyun::Cms::CreateMetricStream
                          ((CmsCreateMetricStreamRequestType *)this,
                           (CmsCreateMetricStreamResponseType *)&req,(CmsErrorInfo *)&resp);
                HttpTestListener::WaitComplete(this_00);
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_238,"127.0.0.1:12234",(allocator<char> *)&local_2b8);
              aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
              std::__cxx11::string::~string((string *)&local_238);
              if ((char)(this->metric)._M_string_length == '\x01') {
                *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
              }
              this_00 = (HttpTestListener *)operator_new(0x180);
              HttpTestListener::HttpTestListener(this_00,0x2fca);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2b8,
                         "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                         ,&local_2b9);
              HttpTestListener::SetResponseBody(this_00,&local_2b8);
              std::__cxx11::string::~string((string *)&local_2b8);
              HttpTestListener::Start(this_00);
              std::__cxx11::string::assign((char *)&req);
              std::__cxx11::string::assign((char *)&req.metric_stream_name);
              std::__cxx11::string::assign((char *)&req.sqls);
              aliyun::Cms::CreateMetrics
                        ((CmsCreateMetricsRequestType *)this,(CmsCreateMetricsResponseType *)&req,
                         (CmsErrorInfo *)&resp);
              HttpTestListener::WaitComplete(this_00);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_238,"127.0.0.1:12234",(allocator<char> *)&local_2b8);
            aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
            std::__cxx11::string::~string((string *)&local_238);
            if ((char)(this->metric)._M_string_length == '\x01') {
              *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
            }
            this_00 = (HttpTestListener *)operator_new(0x180);
            HttpTestListener::HttpTestListener(this_00,0x2fca);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b8,
                       "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": 0}"
                       ,&local_2b9);
            HttpTestListener::SetResponseBody(this_00,&local_2b8);
            std::__cxx11::string::~string((string *)&local_2b8);
            HttpTestListener::Start(this_00);
            std::__cxx11::string::assign((char *)&req);
            aliyun::Cms::CreateDimTable
                      ((CmsCreateDimTableRequestType *)this,(CmsCreateDimTableResponseType *)&req,
                       (CmsErrorInfo *)&resp);
            HttpTestListener::WaitComplete(this_00);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,"127.0.0.1:12234",(allocator<char> *)&local_2b8);
          aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          if ((char)(this->metric)._M_string_length == '\x01') {
            *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
          }
          this_00 = (HttpTestListener *)operator_new(0x180);
          HttpTestListener::HttpTestListener(this_00,0x2fca);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b8,
                     "{  \"Datapoints\": {    \"Datapoint\": [      \"Datapoint\"    ]  },  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                     ,&local_2b9);
          HttpTestListener::SetResponseBody(this_00,&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
          HttpTestListener::Start(this_00);
          std::__cxx11::string::assign((char *)&resp);
          std::__cxx11::string::assign((char *)&resp.message);
          std::__cxx11::string::assign((char *)&resp.success);
          std::__cxx11::string::assign((char *)&resp.trace_id);
          std::__cxx11::string::assign((char *)&resp.result);
          std::__cxx11::string::assign((char *)&local_d8);
          std::__cxx11::string::assign((char *)&local_b8);
          std::__cxx11::string::assign((char *)&local_98);
          aliyun::Cms::BatchQueryMetric
                    ((CmsBatchQueryMetricRequestType *)this,(CmsBatchQueryMetricResponseType *)&resp
                     ,(CmsErrorInfo *)&req);
          HttpTestListener::WaitComplete(this_00);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"127.0.0.1:12234",(allocator<char> *)&local_2b8);
        aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        if ((char)(this->metric)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
        }
        this_00 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(this_00,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,
                   "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\"}"
                   ,&local_2b9);
        HttpTestListener::SetResponseBody(this_00,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        HttpTestListener::Start(this_00);
        std::__cxx11::string::assign((char *)&req);
        std::__cxx11::string::assign((char *)&req.metric_stream_name);
        aliyun::Cms::BatchPutDimTableData
                  ((CmsBatchPutDimTableDataRequestType *)this,
                   (CmsBatchPutDimTableDataResponseType *)&req,(CmsErrorInfo *)&resp);
        HttpTestListener::WaitComplete(this_00);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"127.0.0.1:12234",(allocator<char> *)&local_2b8);
      aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      if ((char)(this->metric)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,
                 "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
                 ,&local_2b9);
      HttpTestListener::SetResponseBody(this_00,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&req.metric_stream_name);
      std::__cxx11::string::assign((char *)&req.sqls);
      aliyun::Cms::BatchCreateSqlMetrics
                ((CmsBatchCreateSqlMetricsRequestType *)this,
                 (CmsBatchCreateSqlMetricsResponseType *)&req,(CmsErrorInfo *)&resp);
      HttpTestListener::WaitComplete(this_00);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"127.0.0.1:12234",(allocator<char> *)&local_2b8);
    aliyun::Cms::SetProxyHost((Cms *)this,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    if ((char)(this->metric)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->metric)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,
               "{  \"Code\": \"Code\",  \"Message\": \"Message\",  \"Success\": \"Success\",  \"TraceId\": \"TraceId\",  \"Result\": \"Result\"}"
               ,&local_2b9);
    HttpTestListener::SetResponseBody(this_00,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    std::__cxx11::string::assign((char *)&req.metric_stream_name);
    std::__cxx11::string::assign((char *)&req.sqls);
    aliyun::Cms::BatchCreateMetrics
              ((CmsBatchCreateMetricsRequestType *)this,(CmsBatchCreateMetricsResponseType *)&req,
               (CmsErrorInfo *)&resp);
    HttpTestListener::WaitComplete(this_00);
  }
  HttpTestListener::~HttpTestListener(this_00);
  operator_delete(this_00,0x180);
  aliyun::Cms::~Cms((Cms *)this);
  operator_delete(this,0x38);
  aliyun::CmsQueryListMetricResponseType::~CmsQueryListMetricResponseType
            ((CmsQueryListMetricResponseType *)&req);
  aliyun::CmsQueryListMetricRequestType::~CmsQueryListMetricRequestType
            ((CmsQueryListMetricRequestType *)&resp);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_batch_create_metrics();
  test_batch_create_sql_metrics();
  test_batch_put_dim_table_data();
  test_batch_query_metric();
  test_create_dim_table();
  test_create_metrics();
  test_create_metric_stream();
  test_create_project();
  test_create_sq_lmetrics();
  test_delete_dim_table();
  test_delete_dim_table_data();
  test_delete_metrics();
  test_delete_metric_stream();
  test_delete_project();
  test_describe_metric();
  test_describe_metric_datum();
  test_describe_metric_list();
  test_get_dim_table();
  test_get_metrics();
  test_get_metrics_meta();
  test_get_metric_statistics();
  test_get_metric_stream();
  test_get_metric_stream_meta();
  test_get_metric_stream_status();
  test_get_project();
  test_get_sq_lmetrics();
  test_list_dim_table();
  test_list_dim_table_data();
  test_list_metrics();
  test_list_metrics_plan();
  test_list_metric_stream();
  test_list_project();
  test_list_sq_lmetrics();
  test_put_dim_table_data();
  test_query_incremental();
  test_query_list_metric();
  test_query_metric();
  test_query_metric_top_n();
  test_query_statistics();
  test_start_metric_stream();
  test_start_project();
  test_status_project();
  test_stop_metric_stream();
  test_stop_project();
  test_update_dim_table();
  test_update_metrics();
  test_update_metric_stream();
  test_update_project();
  test_update_sq_lmetrics();
}